

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O3

void __thiscall
amrex::MLEBABecLap::applyBC
          (MLEBABecLap *this,int amrlev,int mglev,MultiFab *in,BCMode bc_mode,StateMode s_mode,
          MLMGBndry *bndry,bool skip_fillboundary)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  FabSet *pFVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  undefined8 uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int *piVar17;
  long lVar18;
  ulong uVar19;
  int *piVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  double *pdVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  ulong uVar34;
  ulong uVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  Periodicity PVar40;
  int k;
  int j_3;
  IntVect hi;
  IntVect low;
  MFIter mfi;
  FArrayBox foofab;
  long local_608;
  int local_600;
  long local_5f8;
  Array4<double> local_5f0;
  double *local_5b0;
  ulong local_5a8;
  ulong local_5a0;
  ulong local_598;
  ulong local_590;
  double *local_588;
  long local_580;
  int local_578;
  int local_574;
  ulong local_570;
  double *local_568;
  undefined8 uStack_560;
  int *local_558;
  double *local_550;
  double *local_548;
  ulong local_540;
  ulong local_538;
  int local_530;
  int local_52c;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  long local_518;
  long local_510;
  ulong local_508;
  ulong local_500;
  ulong local_4f8;
  double *local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  double *local_4d0;
  double *local_4c8;
  ulong local_4c0;
  int local_4b8;
  int local_4b4;
  Array4<const_int> local_4b0;
  long local_470;
  long local_468;
  long local_460;
  double *local_458;
  double *local_450;
  double *local_448;
  double *local_440;
  long local_438;
  long local_430;
  uint local_428;
  int local_424;
  int local_420;
  int local_41c;
  ulong local_418;
  ulong local_410;
  Array4<const_int> local_408;
  Array4<const_double> local_3c8;
  Box local_388;
  undefined4 uStack_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  FabType local_324;
  double local_320 [4];
  Array4<const_int> local_300;
  long local_2c0;
  long local_2b8;
  ulong local_2b0;
  Array4<const_double> local_2a8;
  Array4<const_double> local_268;
  int local_224;
  double local_220;
  double local_218;
  double local_210;
  long local_208;
  FabArray<amrex::FArrayBox> *local_200;
  FabArray<amrex::EBCellFlagFab> *local_1f8;
  int local_1ec;
  double *local_1e8;
  undefined8 uStack_1e0;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  undefined1 local_1a4 [20];
  uint local_190;
  IndexType local_18c;
  long local_188;
  ulong local_180;
  long local_178;
  double *local_170;
  long local_168;
  long local_160;
  undefined1 local_158 [16];
  FabSet *local_148;
  long local_140;
  double *local_138;
  long local_130;
  FabArray<amrex::IArrayBox> *local_128;
  ulong local_120;
  long *local_118;
  long *local_110;
  MFIter local_108;
  undefined8 local_a8 [3];
  MFItInfo local_8c;
  BaseFab<double> local_78;
  
  local_200 = &in->super_FabArray<amrex::FArrayBox>;
  local_428 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  lVar18 = (long)mglev;
  if (!skip_fillboundary) {
    PVar40 = Geometry::periodicity
                       ((Geometry *)
                        (lVar18 * 200 +
                        *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom
                                  .
                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                        ));
    local_388.smallend.vect[0] = PVar40.period.vect[0];
    local_388.smallend.vect[1] = PVar40.period.vect[1];
    local_388.smallend.vect[2] = PVar40.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (local_200,0,local_428,(Periodicity *)&local_388,false);
  }
  this->m_is_eb_inhomog = (uint)(s_mode == Solution);
  uVar25 = (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.maxorder;
  local_418 = (ulong)uVar25;
  if (4 < (int)uVar25) {
    Assert_host("imaxorder <= 4",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLEBABecLap.cpp"
                ,0x3f9,"\"MLEBABecLap::applyBC: maxorder too high\"");
  }
  local_140 = lVar18 * 0x900 +
              *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.m_maskvals.
                        super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
  ;
  lVar13 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar23 = lVar18 * 200;
  local_210 = *(double *)(lVar13 + 0x38 + lVar23);
  local_218 = *(double *)(lVar13 + 0x40 + lVar23);
  local_220 = *(double *)(lVar13 + 0x48 + lVar23);
  local_128 = (FabArray<amrex::IArrayBox> *)
              (lVar18 * 0x180 +
              *(long *)&(this->m_cc_mask).
                        super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                        super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>);
  local_188 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.m_bcondloc.
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                       + lVar18 * 8);
  lVar18 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory
                               .
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[amrlev].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + lVar18 * 8);
  if ((lVar18 == 0) ||
     (lVar18 = __dynamic_cast(lVar18,&FabFactory<amrex::FArrayBox>::typeinfo,
                              &EBFArrayBoxFactory::typeinfo,0), lVar18 == 0)) {
    local_a8[0] = 0;
    local_a8[1] = 0;
    local_a8[2] = 0;
    local_1f8 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_1f8 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar18 + 0xd8));
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar18 + 0xd8));
  }
  local_388.bigend.vect[1] = 0;
  local_388.bigend.vect[2] = 0;
  local_388.btype.itype = 0;
  local_388.smallend.vect[0] = 0;
  local_388.smallend.vect[1] = 0;
  local_388.smallend.vect[2] = 0;
  local_388.bigend.vect[0] = 0;
  FArrayBox::FArrayBox((FArrayBox *)&local_78,&local_388,local_428,true,false,(Arena *)0x0);
  local_158._8_8_ = local_78.dptr;
  local_1ec = local_78.nvar;
  local_1d0 = (long)local_78.domain.smallend.vect[2];
  local_8c.do_tiling = false;
  local_8c.dynamic = true;
  local_8c.device_sync = true;
  local_8c.num_streams = Gpu::Device::max_gpu_streams;
  local_8c.tilesize.vect[0] = 0;
  local_8c.tilesize.vect[1] = 0;
  local_8c.tilesize.vect[2] = 0;
  MFIter::MFIter(&local_108,&local_200->super_FabArrayBase,&local_8c);
  if (local_108.currentIndex < local_108.endIndex) {
    local_168 = (long)local_78.domain.bigend.vect[2] + 1;
    local_170 = (double *)
                (((long)local_78.domain.bigend.vect[0] - (long)local_78.domain.smallend.vect[0]) + 1
                );
    local_160 = (((long)local_78.domain.bigend.vect[1] + 1) - (long)local_78.domain.smallend.vect[1]
                ) * (long)local_170;
    local_178 = (local_168 - local_1d0) * local_160;
    local_158._4_4_ = local_78.domain.smallend.vect[1];
    local_158._0_4_ = local_78.domain.smallend.vect[0];
    local_180 = (long)local_78.domain.bigend.vect[0] + 1U & 0xffffffff |
                (long)local_78.domain.bigend.vect[1] + 1 << 0x20;
    local_148 = (bndry->super_InterpBndryData).super_BndryData.super_BndryRegister.bndry;
    local_4d8 = (ulong)((int)local_418 - 1);
    local_120 = (ulong)local_428;
    do {
      BATransformer::operator()
                ((Box *)local_1a4,&((local_108.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_108.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_108.currentIndex] * 0x1c +
                        *(long *)&((((local_108.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_5f0,local_200,&local_108);
      local_324 = regular;
      if (local_1f8 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
LAB_006cb515:
        piVar17 = &local_108.currentIndex;
        if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar17 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_108.currentIndex;
        }
        local_118 = (long *)(*(long *)(local_188 + 0x200) + (long)*piVar17 * 0x18);
        local_110 = (long *)((long)*piVar17 * 0x18 + *(long *)(local_188 + 0xf0));
        lVar18 = 0;
        do {
          local_388.smallend.vect[2] = local_1a4._8_4_;
          local_388.smallend.vect[0] = (int)local_1a4._0_8_;
          local_388.smallend.vect[1] = SUB84(local_1a4._0_8_,4);
          local_408.jstride._0_4_ = local_190;
          local_408.p = (int *)local_1a4._12_8_;
          iVar5 = local_388.smallend.vect[lVar18] + -1;
          local_388.smallend.vect[lVar18] = iVar5;
          *(int *)((long)&local_408.p + lVar18 * 4) = iVar5;
          iVar7 = local_388.smallend.vect[2];
          iVar16 = local_388.smallend.vect[1];
          iVar5 = local_388.smallend.vect[0];
          uVar15 = (uint)local_408.jstride;
          piVar17 = local_408.p;
          local_570 = (ulong)(uint)local_388.smallend.vect[0];
          local_5a0 = (ulong)(uint)local_388.smallend.vect[1];
          local_5a8 = (ulong)(uint)local_388.smallend.vect[2];
          local_538 = (ulong)local_408.p & 0xffffffff;
          uVar3 = local_408.p._4_4_;
          local_540 = (ulong)local_408.p._4_4_;
          local_388.smallend.vect[2] = local_1a4._8_4_;
          local_388.smallend.vect[0] = (int)local_1a4._0_8_;
          local_388.smallend.vect[1] = SUB84(local_1a4._0_8_,4);
          local_408.jstride._0_4_ = local_190;
          local_408.p = (int *)local_1a4._12_8_;
          local_300.p = (int *)(CONCAT44(local_18c.itype >> 1,local_18c.itype) & 0x100000001);
          local_300.jstride._0_4_ = local_18c.itype >> 2 & 1;
          iVar6 = (~*(uint *)((long)&local_300.p + lVar18 * 4) & 1) +
                  *(int *)((long)&local_408.p + lVar18 * 4);
          local_388.smallend.vect[lVar18] = iVar6;
          *(int *)((long)&local_408.p + lVar18 * 4) = iVar6;
          lVar13 = local_140;
          local_600 = local_388.smallend.vect[0];
          local_4e0 = (ulong)local_408.p & 0xffffffff;
          uVar25 = local_388.smallend.vect[2];
          uVar24 = local_388.smallend.vect[1];
          uVar10 = (uint)local_408.jstride;
          uVar9 = local_408.p._4_4_;
          if (local_324 != regular) {
            if ((int)lVar18 == 1) {
              local_570 = (ulong)(iVar5 - 1);
              local_5a8 = (ulong)(iVar7 - 1);
              local_538 = (ulong)((int)piVar17 + 1);
              uVar12 = 1;
              iVar5 = 1;
            }
            else if ((int)lVar18 == 0) {
              local_5a0 = (ulong)(iVar16 - 1);
              local_5a8 = (ulong)(iVar7 - 1);
              local_540 = (ulong)(uVar3 + 1);
              iVar5 = 1;
              uVar12 = 0x100000000;
            }
            else {
              local_570 = (ulong)(iVar5 - 1);
              local_5a0 = (ulong)(iVar16 - 1);
              local_538 = (ulong)((int)piVar17 + 1);
              local_540 = (ulong)(uVar3 + 1);
              uVar12 = 0x100000001;
              iVar5 = 0;
            }
            uVar15 = uVar15 + iVar5;
            local_600 = local_388.smallend.vect[0] - (int)uVar12;
            iVar16 = (int)((ulong)uVar12 >> 0x20);
            uVar24 = local_388.smallend.vect[1] - iVar16;
            uVar25 = local_388.smallend.vect[2] - iVar5;
            local_4e0 = (ulong)(uint)((int)local_408.p + (int)uVar12);
            uVar9 = local_408.p._4_4_ + iVar16;
            uVar10 = (uint)local_408.jstride + iVar5;
          }
          local_4e8 = (ulong)uVar9;
          local_4f8 = (ulong)uVar15;
          local_500 = (ulong)uVar10;
          local_590 = (ulong)uVar24;
          local_598 = (ulong)uVar25;
          iVar5 = *(int *)(local_1a4 + lVar18 * 4 + 0xc);
          iVar16 = *(int *)(local_1a4 + lVar18 * 4);
          local_208 = lVar18;
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&local_408,(FabArray<amrex::Mask> *)(lVar18 * 0x180 + local_140),&local_108);
          FabArray<amrex::Mask>::array<amrex::Mask,_0>
                    (&local_300,(FabArray<amrex::Mask> *)((lVar18 + 3) * 0x180 + lVar13),&local_108)
          ;
          pFVar4 = local_148;
          if (bndry == (MLMGBndry *)0x0) {
            local_268.p = (double *)local_158._8_8_;
            local_268.jstride = (Long)local_170;
            local_268.kstride = local_160;
            local_268.nstride = local_178;
            local_268.begin.x = local_158._0_4_;
            local_268.begin.y = local_158._4_4_;
            local_268.begin.z = (int)local_1d0;
            local_268.end.x = (undefined4)local_180;
            local_268.end.y = local_180._4_4_;
            local_268.end.z = (int)local_168;
            local_268.ncomp = local_1ec;
            local_2a8.p = (double *)local_158._8_8_;
            local_2a8.jstride = (Long)local_170;
            local_2a8.kstride = local_160;
            local_2a8.nstride = local_178;
            local_2a8.begin.x = local_158._0_4_;
            local_2a8.begin.y = local_158._4_4_;
            local_2a8.begin.z = (int)local_1d0;
            local_2a8.end.x = (undefined4)local_180;
            local_2a8.end.y = local_180._4_4_;
            local_2a8.end.z = (int)local_168;
            local_2a8.ncomp = local_1ec;
          }
          else {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_268,(FabArray<amrex::FArrayBox> *)(local_148 + lVar18),&local_108);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_2a8,(FabArray<amrex::FArrayBox> *)(pFVar4 + lVar18 + 3),&local_108);
          }
          if (0 < (int)local_428) {
            uVar25 = (iVar5 - iVar16) + 2;
            uVar35 = (ulong)uVar25;
            if ((int)local_418 < (int)uVar25) {
              uVar35 = local_418 & 0xffffffff;
            }
            local_41c = (int)local_5a0;
            local_52c = local_41c + 1;
            local_420 = (int)local_590;
            local_4b4 = local_420 + -1;
            iVar5 = (int)local_570;
            local_424 = iVar5 + 1;
            local_510 = (long)local_41c;
            local_2b8 = (long)iVar5;
            local_528 = (int)local_538 + 1;
            local_2c0 = (long)local_600;
            local_524 = (int)local_4e0 + 1;
            local_51c = (int)local_540 + 1;
            local_518 = (long)local_420;
            local_520 = (int)local_4e8 + 1;
            local_410 = (ulong)(uint)(local_528 - iVar5);
            uVar34 = (ulong)(uint)(local_524 - local_600);
            local_41c = local_51c - local_41c;
            local_420 = local_520 - local_420;
            local_530 = (int)local_5a8 + 1;
            local_4b8 = (int)local_598 + -1;
            uVar25 = (uint)uVar35;
            local_2b0 = (ulong)(uVar25 - 1);
            local_458 = (double *)(long)(int)local_5a8;
            local_574 = (int)local_4f8 + 1;
            local_460 = (long)(int)local_598;
            local_578 = (int)local_500 + 1;
            local_430 = local_2b8 * 8;
            local_468 = local_2b8 * 4;
            local_438 = local_2c0 * 8;
            local_470 = local_2c0 * 4;
            local_1b0 = (long)local_424;
            local_1c0 = (long)local_424 * 4;
            local_224 = local_600 + -1;
            local_1b8 = (long)local_224;
            local_1c8 = (long)local_224 * 4;
            local_580 = 0;
            uVar8 = 0;
            uVar19 = local_4d8;
            local_508 = uVar34;
            do {
              dVar39 = 1.0;
              dVar37 = 1.0;
              lVar13 = uVar8 * 0x18 + *local_110;
              lVar18 = uVar8 * 0x30 + *local_118;
              iVar5 = *(int *)(lVar13 + local_208 * 4);
              iVar16 = *(int *)(lVar13 + 0xc + local_208 * 4);
              pdVar28 = *(double **)(lVar18 + local_208 * 8);
              pdVar1 = *(double **)(lVar18 + 0x18 + local_208 * 8);
              local_558 = (int *)CONCAT44(local_558._4_4_,iVar16);
              local_4c0 = uVar8;
              if (local_324 == regular) {
                iVar7 = (int)local_5a0;
                iVar6 = (int)local_4f8;
                iVar22 = (int)local_538;
                iVar26 = (int)local_410;
                iVar21 = (int)local_500;
                iVar11 = (int)local_4e0;
                if ((int)local_208 == 1) {
                  if (iVar5 == 0x65) {
                    dVar36 = -(double)pdVar28 * local_218;
                    local_388.smallend.vect[0] = SUB84(dVar36,0);
                    local_388.smallend.vect[1] = (int)((ulong)dVar36 >> 0x20);
                    local_388.smallend.vect[2] = 0;
                    local_388.bigend.vect[0] = 0x3fe00000;
                    local_388.bigend.vect[1] = 0;
                    local_388.bigend.vect[2] = 0x3ff80000;
                    local_388.btype.itype = 0;
                    uStack_36c = 0x40040000;
                    local_3c8.kstride = 0;
                    local_3c8.nstride = 0;
                    local_3c8.p = (double *)0x0;
                    local_3c8.jstride = 0;
                    local_388.smallend.vect._0_8_ = dVar36;
                    if (0 < (int)uVar25) {
                      uVar34 = 0;
                      do {
                        uVar19 = 0;
                        dVar36 = dVar37;
                        dVar38 = dVar39;
                        do {
                          if (uVar34 != uVar19) {
                            dVar2 = *(double *)(local_388.smallend.vect + uVar19 * 2);
                            dVar36 = dVar36 * (-0.5 - dVar2);
                            dVar38 = dVar38 * (*(double *)(local_388.smallend.vect + uVar34 * 2) -
                                              dVar2);
                          }
                          uVar19 = uVar19 + 1;
                        } while (uVar35 != uVar19);
                        (&local_3c8.p)[uVar34] = (double *)(dVar36 / dVar38);
                        uVar34 = uVar34 + 1;
                      } while (uVar34 != uVar35);
                    }
                    uVar34 = local_508;
                    uVar19 = local_4d8;
                    if ((int)local_5a8 <= iVar6) {
                      local_5b0 = (double *)(long)local_408.begin.z;
                      local_588 = (double *)local_408.kstride;
                      pdVar28 = local_458;
                      do {
                        if ((int)local_570 <= iVar22) {
                          local_568 = local_5f0.p +
                                      ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride
                                      + local_5f0.nstride * uVar8;
                          lVar13 = (iVar7 - local_5f0.begin.y) * local_5f0.jstride;
                          lVar18 = local_2b8;
                          do {
                            if (0 < local_408.p
                                    [((long)iVar7 - (long)local_408.begin.y) *
                                     CONCAT44(local_408.jstride._4_4_,(uint)local_408.jstride) +
                                     ((long)pdVar28 - (long)local_5b0) * local_408.kstride +
                                     (lVar18 - local_408.begin.x)]) {
                              lVar23 = lVar18 - local_5f0.begin.x;
                              dVar36 = 0.0;
                              if (1 < (int)uVar25) {
                                uVar34 = 1;
                                do {
                                  dVar36 = dVar36 + local_568[lVar23 + ((iVar7 - local_5f0.begin.y)
                                                                       + (int)uVar34) *
                                                                       local_5f0.jstride] *
                                                    (double)(&local_3c8.p)[uVar34];
                                  uVar34 = uVar34 + 1;
                                } while (uVar35 != uVar34);
                              }
                              local_568[lVar13 + lVar23] = dVar36;
                              if (bc_mode == Inhomogeneous) {
                                local_568[lVar13 + lVar23] =
                                     local_268.p
                                     [((long)iVar7 - (long)local_268.begin.y) * local_268.jstride +
                                      ((long)pdVar28 - (long)local_268.begin.z) * local_268.kstride
                                      + local_268.nstride * uVar8 + (lVar18 - local_268.begin.x)] *
                                     (double)local_3c8.p + dVar36;
                              }
                            }
                            lVar18 = lVar18 + 1;
                          } while (local_528 != (int)lVar18);
                        }
                        pdVar28 = (double *)((long)pdVar28 + 1);
                        uVar34 = local_508;
                      } while (local_574 != (int)pdVar28);
                    }
                  }
                  else if (iVar5 == 0x66) {
                    if ((int)local_5a8 <= iVar6) {
                      lVar18 = (long)local_408.p +
                               ((long)local_458 - (long)local_408.begin.z) * local_408.kstride * 4 +
                               (long)(iVar7 - local_408.begin.y) *
                               CONCAT44(local_408.jstride._4_4_,(uint)local_408.jstride) * 4 +
                               (long)local_408.begin.x * -4 + local_468;
                      pdVar28 = local_458;
                      do {
                        if ((int)local_570 <= iVar22) {
                          lVar23 = ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride;
                          lVar13 = 0;
                          do {
                            if (0 < *(int *)(lVar18 + lVar13 * 4)) {
                              *(undefined8 *)
                               ((long)local_5f0.p +
                               lVar13 * 8 +
                               local_5f0.jstride * 8 * (long)(iVar7 - local_5f0.begin.y) +
                               lVar23 * 8 + local_5f0.nstride * local_580 +
                               (long)local_5f0.begin.x * -8 + local_430) =
                                   *(undefined8 *)
                                    ((long)local_5f0.p +
                                    lVar13 * 8 +
                                    (long)(local_52c - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                    lVar23 * 8 + local_5f0.nstride * local_580 +
                                    (long)local_5f0.begin.x * -8 + local_430);
                            }
                            lVar13 = lVar13 + 1;
                          } while (iVar26 != (int)lVar13);
                        }
                        pdVar28 = (double *)((long)pdVar28 + 1);
                        lVar18 = lVar18 + local_408.kstride * 4;
                      } while (local_574 != (int)pdVar28);
                    }
                  }
                  else if ((iVar5 == 0x67) && ((int)local_5a8 <= iVar6)) {
                    lVar18 = (long)local_408.p +
                             ((long)local_458 - (long)local_408.begin.z) * local_408.kstride * 4 +
                             (long)(iVar7 - local_408.begin.y) *
                             CONCAT44(local_408.jstride._4_4_,(uint)local_408.jstride) * 4 +
                             (long)local_408.begin.x * -4 + local_468;
                    pdVar28 = local_458;
                    do {
                      if ((int)local_570 <= iVar22) {
                        lVar23 = ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride;
                        lVar13 = 0;
                        do {
                          if (0 < *(int *)(lVar18 + lVar13 * 4)) {
                            *(ulong *)((long)local_5f0.p +
                                      lVar13 * 8 +
                                      local_5f0.jstride * 8 * (long)(iVar7 - local_5f0.begin.y) +
                                      lVar23 * 8 + local_5f0.nstride * local_580 +
                                      (long)local_5f0.begin.x * -8 + local_430) =
                                 *(ulong *)((long)local_5f0.p +
                                           lVar13 * 8 +
                                           (long)(local_52c - local_5f0.begin.y) *
                                           local_5f0.jstride * 8 + lVar23 * 8 +
                                           local_5f0.nstride * local_580 +
                                           (long)local_5f0.begin.x * -8 + local_430) ^
                                 0x8000000000000000;
                          }
                          lVar13 = lVar13 + 1;
                        } while (iVar26 != (int)lVar13);
                      }
                      pdVar28 = (double *)((long)pdVar28 + 1);
                      lVar18 = lVar18 + local_408.kstride * 4;
                    } while (local_574 != (int)pdVar28);
                  }
                  if (iVar16 == 0x65) {
                    dVar36 = -(double)pdVar1 * local_218;
                    local_388.smallend.vect[0] = SUB84(dVar36,0);
                    local_388.smallend.vect[1] = (int)((ulong)dVar36 >> 0x20);
                    local_388.smallend.vect[2] = 0;
                    local_388.bigend.vect[0] = 0x3fe00000;
                    local_388.bigend.vect[1] = 0;
                    local_388.bigend.vect[2] = 0x3ff80000;
                    local_388.btype.itype = 0;
                    uStack_36c = 0x40040000;
                    local_3c8.kstride = 0;
                    local_3c8.nstride = 0;
                    local_3c8.p = (double *)0x0;
                    local_3c8.jstride = 0;
                    local_388.smallend.vect._0_8_ = dVar36;
                    if (0 < (int)uVar25) {
                      uVar34 = 0;
                      do {
                        uVar19 = 0;
                        dVar36 = dVar37;
                        dVar38 = dVar39;
                        do {
                          if (uVar34 != uVar19) {
                            dVar2 = *(double *)(local_388.smallend.vect + uVar19 * 2);
                            dVar36 = dVar36 * (-0.5 - dVar2);
                            dVar38 = dVar38 * (*(double *)(local_388.smallend.vect + uVar34 * 2) -
                                              dVar2);
                          }
                          uVar19 = uVar19 + 1;
                        } while (uVar35 != uVar19);
                        (&local_3c8.p)[uVar34] = (double *)(dVar36 / dVar38);
                        uVar34 = uVar34 + 1;
                      } while (uVar34 != uVar35);
                    }
                    uVar34 = local_508;
                    uVar19 = local_4d8;
                    if ((int)local_598 <= iVar21) {
                      local_558 = (int *)(long)local_300.begin.z;
                      local_588 = (double *)local_300.kstride;
                      local_5b0 = (double *)
                                  (local_300.p +
                                  ((long)(int)local_590 - (long)local_300.begin.y) *
                                  CONCAT44(local_300.jstride._4_4_,(uint)local_300.jstride));
                      local_608 = local_460;
                      do {
                        if (local_600 <= iVar11) {
                          local_568 = local_5f0.p +
                                      (local_608 - local_5f0.begin.z) * local_5f0.kstride +
                                      local_5f0.nstride * uVar8;
                          lVar13 = ((int)local_590 - local_5f0.begin.y) * local_5f0.jstride;
                          lVar18 = local_2c0;
                          do {
                            if (0 < *(int *)((long)local_5b0 +
                                            (lVar18 - local_300.begin.x) * 4 +
                                            (local_608 - (long)local_558) * local_300.kstride * 4))
                            {
                              lVar23 = lVar18 - local_5f0.begin.x;
                              dVar37 = 0.0;
                              if (1 < (int)uVar25) {
                                uVar34 = 1;
                                iVar5 = local_4b4 - local_5f0.begin.y;
                                do {
                                  dVar37 = dVar37 + local_568[lVar23 + local_5f0.jstride * iVar5] *
                                                    (double)(&local_3c8.p)[uVar34];
                                  uVar34 = uVar34 + 1;
                                  iVar5 = iVar5 + -1;
                                } while (uVar35 != uVar34);
                              }
                              local_568[lVar13 + lVar23] = dVar37;
                              if (bc_mode == Inhomogeneous) {
                                local_568[lVar13 + lVar23] =
                                     local_2a8.p
                                     [((long)(int)local_590 - (long)local_2a8.begin.y) *
                                      local_2a8.jstride +
                                      (local_608 - local_2a8.begin.z) * local_2a8.kstride +
                                      local_2a8.nstride * uVar8 + (lVar18 - local_2a8.begin.x)] *
                                     (double)local_3c8.p + dVar37;
                              }
                            }
                            lVar18 = lVar18 + 1;
                          } while (local_524 != (int)lVar18);
                        }
                        local_608 = local_608 + 1;
                        uVar34 = local_508;
                      } while (local_578 != (int)local_608);
                    }
                  }
                  else if (iVar16 == 0x66) {
                    if ((int)local_598 <= iVar21) {
                      lVar13 = (long)local_300.p +
                               (local_460 - local_300.begin.z) * local_300.kstride * 4 +
                               (long)((int)local_590 - local_300.begin.y) *
                               CONCAT44(local_300.jstride._4_4_,(uint)local_300.jstride) * 4 +
                               (long)local_300.begin.x * -4 + local_470;
                      lVar18 = local_460;
                      do {
                        if (local_600 <= iVar11) {
                          lVar23 = (lVar18 - local_5f0.begin.z) * local_5f0.kstride;
                          lVar30 = 0;
                          do {
                            if (0 < *(int *)(lVar13 + lVar30 * 4)) {
                              *(undefined8 *)
                               ((long)local_5f0.p +
                               lVar30 * 8 +
                               local_5f0.jstride * 8 * (long)((int)local_590 - local_5f0.begin.y) +
                               lVar23 * 8 + local_5f0.nstride * local_580 +
                               (long)local_5f0.begin.x * -8 + local_438) =
                                   *(undefined8 *)
                                    ((long)local_5f0.p +
                                    lVar30 * 8 +
                                    (long)(~local_5f0.begin.y + (int)local_590) *
                                    local_5f0.jstride * 8 + lVar23 * 8 +
                                    local_5f0.nstride * local_580 + (long)local_5f0.begin.x * -8 +
                                    local_438);
                            }
                            lVar30 = lVar30 + 1;
                          } while ((int)uVar34 != (int)lVar30);
                        }
                        lVar18 = lVar18 + 1;
                        lVar13 = lVar13 + local_300.kstride * 4;
                      } while (local_578 != (int)lVar18);
                    }
                  }
                  else if ((iVar16 == 0x67) && ((int)local_598 <= iVar21)) {
                    lVar13 = (long)local_300.p +
                             (local_460 - local_300.begin.z) * local_300.kstride * 4 +
                             (long)((int)local_590 - local_300.begin.y) *
                             CONCAT44(local_300.jstride._4_4_,(uint)local_300.jstride) * 4 +
                             (long)local_300.begin.x * -4 + local_470;
                    lVar18 = local_460;
                    do {
                      if (local_600 <= iVar11) {
                        lVar23 = (lVar18 - local_5f0.begin.z) * local_5f0.kstride;
                        lVar30 = 0;
                        do {
                          if (0 < *(int *)(lVar13 + lVar30 * 4)) {
                            *(ulong *)((long)local_5f0.p +
                                      lVar30 * 8 +
                                      local_5f0.jstride * 8 *
                                      (long)((int)local_590 - local_5f0.begin.y) + lVar23 * 8 +
                                      local_5f0.nstride * local_580 + (long)local_5f0.begin.x * -8 +
                                      local_438) =
                                 *(ulong *)((long)local_5f0.p +
                                           lVar30 * 8 +
                                           (long)(~local_5f0.begin.y + (int)local_590) *
                                           local_5f0.jstride * 8 + lVar23 * 8 +
                                           local_5f0.nstride * local_580 +
                                           (long)local_5f0.begin.x * -8 + local_438) ^
                                 0x8000000000000000;
                          }
                          lVar30 = lVar30 + 1;
                        } while ((int)uVar34 != (int)lVar30);
                      }
                      lVar18 = lVar18 + 1;
                      lVar13 = lVar13 + local_300.kstride * 4;
                    } while (local_578 != (int)lVar18);
                  }
                }
                else {
                  iVar27 = (int)local_540;
                  iVar29 = (int)local_4e8;
                  if ((int)local_208 == 0) {
                    if (iVar5 == 0x65) {
                      dVar36 = -(double)pdVar28 * local_210;
                      local_388.smallend.vect[0] = SUB84(dVar36,0);
                      local_388.smallend.vect[1] = (int)((ulong)dVar36 >> 0x20);
                      local_388.smallend.vect[2] = 0;
                      local_388.bigend.vect[0] = 0x3fe00000;
                      local_388.bigend.vect[1] = 0;
                      local_388.bigend.vect[2] = 0x3ff80000;
                      local_388.btype.itype = 0;
                      uStack_36c = 0x40040000;
                      local_3c8.kstride = 0;
                      local_3c8.nstride = 0;
                      local_3c8.p = (double *)0x0;
                      local_3c8.jstride = 0;
                      local_388.smallend.vect._0_8_ = dVar36;
                      if (0 < (int)uVar25) {
                        uVar19 = 0;
                        do {
                          uVar14 = 0;
                          dVar36 = dVar37;
                          dVar38 = dVar39;
                          do {
                            if (uVar19 != uVar14) {
                              dVar2 = *(double *)(local_388.smallend.vect + uVar14 * 2);
                              dVar36 = dVar36 * (-0.5 - dVar2);
                              dVar38 = dVar38 * (*(double *)(local_388.smallend.vect + uVar19 * 2) -
                                                dVar2);
                            }
                            uVar14 = uVar14 + 1;
                          } while (uVar35 != uVar14);
                          (&local_3c8.p)[uVar19] = (double *)(dVar36 / dVar38);
                          uVar19 = uVar19 + 1;
                        } while (uVar19 != uVar35);
                      }
                      uVar19 = local_4d8;
                      if ((int)local_5a8 <= iVar6) {
                        local_5b0 = (double *)(long)(int)local_570;
                        local_548 = (double *)local_408.kstride;
                        local_550 = (double *)(long)local_408.begin.z;
                        local_588 = (double *)
                                    (local_408.p + ((long)local_5b0 - (long)local_408.begin.x));
                        pdVar28 = local_458;
                        do {
                          if (iVar7 <= iVar27) {
                            local_568 = local_5f0.p +
                                        ((long)pdVar28 - (long)local_5f0.begin.z) *
                                        local_5f0.kstride + local_5f0.nstride * uVar8;
                            iVar5 = (int)local_570 - local_5f0.begin.x;
                            lVar18 = local_510;
                            do {
                              if (0 < *(int *)((long)local_588 +
                                              (lVar18 - local_408.begin.y) *
                                              CONCAT44(local_408.jstride._4_4_,
                                                       (uint)local_408.jstride) * 4 +
                                              ((long)pdVar28 - (long)local_550) * local_408.kstride
                                              * 4)) {
                                lVar13 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                                dVar36 = 0.0;
                                if (1 < (int)uVar25) {
                                  uVar34 = 1;
                                  do {
                                    dVar36 = dVar36 + local_568[lVar13 + ((int)uVar34 + iVar5)] *
                                                      (double)(&local_3c8.p)[uVar34];
                                    uVar34 = uVar34 + 1;
                                  } while (uVar35 != uVar34);
                                }
                                local_568[iVar5 + lVar13] = dVar36;
                                uVar34 = local_508;
                                if (bc_mode == Inhomogeneous) {
                                  local_568[iVar5 + lVar13] =
                                       local_268.p
                                       [(long)local_5b0 +
                                        ((((long)pdVar28 - (long)local_268.begin.z) *
                                          local_268.kstride +
                                         local_268.nstride * uVar8 +
                                         (lVar18 - local_268.begin.y) * local_268.jstride) -
                                        (long)local_268.begin.x)] * (double)local_3c8.p + dVar36;
                                }
                              }
                              lVar18 = lVar18 + 1;
                            } while (local_51c != (int)lVar18);
                          }
                          pdVar28 = (double *)((long)pdVar28 + 1);
                        } while (local_574 != (int)pdVar28);
                      }
                    }
                    else if (iVar5 == 0x66) {
                      if ((int)local_5a8 <= iVar6) {
                        piVar17 = (int *)((long)local_408.p +
                                         ((long)local_458 - (long)local_408.begin.z) *
                                         local_408.kstride * 4 +
                                         (local_510 - local_408.begin.y) *
                                         CONCAT44(local_408.jstride._4_4_,(uint)local_408.jstride) *
                                         4 + (long)local_408.begin.x * -4 + local_468);
                        pdVar28 = local_458;
                        do {
                          if (iVar7 <= iVar27) {
                            lVar18 = local_5f0.nstride * local_580 +
                                     (local_510 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                     ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride *
                                     8 + (long)local_5f0.p;
                            piVar20 = piVar17;
                            iVar5 = local_41c;
                            do {
                              if (0 < *piVar20) {
                                *(undefined8 *)(lVar18 + local_430 + (long)local_5f0.begin.x * -8) =
                                     *(undefined8 *)
                                      (lVar18 + (long)(local_424 - local_5f0.begin.x) * 8);
                              }
                              lVar18 = lVar18 + local_5f0.jstride * 8;
                              piVar20 = piVar20 + CONCAT44(local_408.jstride._4_4_,
                                                           (uint)local_408.jstride);
                              iVar5 = iVar5 + -1;
                            } while (iVar5 != 0);
                          }
                          pdVar28 = (double *)((long)pdVar28 + 1);
                          piVar17 = piVar17 + local_408.kstride;
                        } while (local_574 != (int)pdVar28);
                      }
                    }
                    else if ((iVar5 == 0x67) && ((int)local_5a8 <= iVar6)) {
                      piVar17 = (int *)((long)local_408.p +
                                       ((long)local_458 - (long)local_408.begin.z) *
                                       local_408.kstride * 4 +
                                       (local_510 - local_408.begin.y) *
                                       CONCAT44(local_408.jstride._4_4_,(uint)local_408.jstride) * 4
                                       + (long)local_408.begin.x * -4 + local_468);
                      pdVar28 = local_458;
                      do {
                        if (iVar7 <= iVar27) {
                          lVar18 = local_5f0.nstride * local_580 +
                                   (local_510 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                   ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride * 8
                                   + (long)local_5f0.p;
                          piVar20 = piVar17;
                          iVar5 = local_41c;
                          do {
                            if (0 < *piVar20) {
                              *(ulong *)(lVar18 + local_430 + (long)local_5f0.begin.x * -8) =
                                   *(ulong *)(lVar18 + (long)(local_424 - local_5f0.begin.x) * 8) ^
                                   0x8000000000000000;
                            }
                            lVar18 = lVar18 + local_5f0.jstride * 8;
                            piVar20 = piVar20 + CONCAT44(local_408.jstride._4_4_,
                                                         (uint)local_408.jstride);
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                        }
                        pdVar28 = (double *)((long)pdVar28 + 1);
                        piVar17 = piVar17 + local_408.kstride;
                      } while (local_574 != (int)pdVar28);
                    }
                    if (iVar16 == 0x65) {
                      dVar36 = -(double)pdVar1 * local_210;
                      local_388.smallend.vect[0] = SUB84(dVar36,0);
                      local_388.smallend.vect[1] = (int)((ulong)dVar36 >> 0x20);
                      local_388.smallend.vect[2] = 0;
                      local_388.bigend.vect[0] = 0x3fe00000;
                      local_388.bigend.vect[1] = 0;
                      local_388.bigend.vect[2] = 0x3ff80000;
                      local_388.btype.itype = 0;
                      uStack_36c = 0x40040000;
                      local_3c8.kstride = 0;
                      local_3c8.nstride = 0;
                      local_3c8.p = (double *)0x0;
                      local_3c8.jstride = 0;
                      local_388.smallend.vect._0_8_ = dVar36;
                      if (0 < (int)uVar25) {
                        uVar19 = 0;
                        do {
                          uVar14 = 0;
                          dVar36 = dVar37;
                          dVar38 = dVar39;
                          do {
                            if (uVar19 != uVar14) {
                              dVar2 = *(double *)(local_388.smallend.vect + uVar14 * 2);
                              dVar36 = dVar36 * (-0.5 - dVar2);
                              dVar38 = dVar38 * (*(double *)(local_388.smallend.vect + uVar19 * 2) -
                                                dVar2);
                            }
                            uVar14 = uVar14 + 1;
                          } while (uVar35 != uVar14);
                          (&local_3c8.p)[uVar19] = (double *)(dVar36 / dVar38);
                          uVar19 = uVar19 + 1;
                        } while (uVar19 != uVar35);
                      }
                      uVar19 = local_4d8;
                      if ((int)local_598 <= iVar21) {
                        local_5b0 = (double *)(long)local_600;
                        local_588 = (double *)local_300.kstride;
                        local_548 = (double *)(long)local_300.begin.z;
                        local_558 = local_300.p + ((long)local_5b0 - (long)local_300.begin.x);
                        lVar18 = local_460;
                        do {
                          if ((int)local_590 <= iVar29) {
                            local_568 = local_5f0.p +
                                        (lVar18 - local_5f0.begin.z) * local_5f0.kstride +
                                        local_5f0.nstride * uVar8;
                            lVar13 = local_518;
                            do {
                              if (0 < local_558[(lVar18 - (long)local_548) * local_300.kstride +
                                                (lVar13 - local_300.begin.y) *
                                                CONCAT44(local_300.jstride._4_4_,
                                                         (uint)local_300.jstride)]) {
                                lVar23 = (lVar13 - local_5f0.begin.y) * local_5f0.jstride;
                                dVar37 = 0.0;
                                if (1 < (int)uVar25) {
                                  uVar34 = 1;
                                  iVar5 = local_224 - local_5f0.begin.x;
                                  do {
                                    dVar37 = dVar37 + local_568[lVar23 + iVar5] *
                                                      (double)(&local_3c8.p)[uVar34];
                                    uVar34 = uVar34 + 1;
                                    iVar5 = iVar5 + -1;
                                  } while (uVar35 != uVar34);
                                }
                                local_568[(local_600 - local_5f0.begin.x) + lVar23] = dVar37;
                                uVar34 = local_508;
                                if (bc_mode == Inhomogeneous) {
                                  local_568[(local_600 - local_5f0.begin.x) + lVar23] =
                                       local_2a8.p
                                       [(long)local_5b0 +
                                        (((lVar18 - local_2a8.begin.z) * local_2a8.kstride +
                                         local_2a8.nstride * uVar8 +
                                         (lVar13 - local_2a8.begin.y) * local_2a8.jstride) -
                                        (long)local_2a8.begin.x)] * (double)local_3c8.p + dVar37;
                                }
                              }
                              lVar13 = lVar13 + 1;
                            } while (local_520 != (int)lVar13);
                          }
                          lVar18 = lVar18 + 1;
                        } while (local_578 != (int)lVar18);
                      }
                    }
                    else if (iVar16 == 0x66) {
                      if ((int)local_598 <= iVar21) {
                        piVar17 = (int *)((long)local_300.p +
                                         (local_460 - local_300.begin.z) * local_300.kstride * 4 +
                                         (local_518 - local_300.begin.y) *
                                         CONCAT44(local_300.jstride._4_4_,(uint)local_300.jstride) *
                                         4 + (long)local_300.begin.x * -4 + local_470);
                        lVar18 = local_460;
                        do {
                          if ((int)local_590 <= iVar29) {
                            lVar13 = local_5f0.nstride * local_580 +
                                     (local_518 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                     (lVar18 - local_5f0.begin.z) * local_5f0.kstride * 8 +
                                     (long)local_5f0.p;
                            piVar20 = piVar17;
                            iVar5 = local_420;
                            do {
                              if (0 < *piVar20) {
                                *(undefined8 *)(lVar13 + local_438 + (long)local_5f0.begin.x * -8) =
                                     *(undefined8 *)
                                      (lVar13 + (long)(~local_5f0.begin.x + local_600) * 8);
                              }
                              lVar13 = lVar13 + local_5f0.jstride * 8;
                              piVar20 = piVar20 + CONCAT44(local_300.jstride._4_4_,
                                                           (uint)local_300.jstride);
                              iVar5 = iVar5 + -1;
                            } while (iVar5 != 0);
                          }
                          lVar18 = lVar18 + 1;
                          piVar17 = piVar17 + local_300.kstride;
                        } while (local_578 != (int)lVar18);
                      }
                    }
                    else if ((iVar16 == 0x67) && ((int)local_598 <= iVar21)) {
                      piVar17 = (int *)((long)local_300.p +
                                       (local_460 - local_300.begin.z) * local_300.kstride * 4 +
                                       (local_518 - local_300.begin.y) *
                                       CONCAT44(local_300.jstride._4_4_,(uint)local_300.jstride) * 4
                                       + (long)local_300.begin.x * -4 + local_470);
                      lVar18 = local_460;
                      do {
                        if ((int)local_590 <= iVar29) {
                          lVar13 = local_5f0.nstride * local_580 +
                                   (local_518 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                   (lVar18 - local_5f0.begin.z) * local_5f0.kstride * 8 +
                                   (long)local_5f0.p;
                          piVar20 = piVar17;
                          iVar5 = local_420;
                          do {
                            if (0 < *piVar20) {
                              *(ulong *)(lVar13 + local_438 + (long)local_5f0.begin.x * -8) =
                                   *(ulong *)(lVar13 + (long)(~local_5f0.begin.x + local_600) * 8) ^
                                   0x8000000000000000;
                            }
                            lVar13 = lVar13 + local_5f0.jstride * 8;
                            piVar20 = piVar20 + CONCAT44(local_300.jstride._4_4_,
                                                         (uint)local_300.jstride);
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                        }
                        lVar18 = lVar18 + 1;
                        piVar17 = piVar17 + local_300.kstride;
                      } while (local_578 != (int)lVar18);
                    }
                  }
                  else {
                    if (iVar5 == 0x65) {
                      dVar36 = -(double)pdVar28 * local_220;
                      local_388.smallend.vect[0] = SUB84(dVar36,0);
                      local_388.smallend.vect[1] = (int)((ulong)dVar36 >> 0x20);
                      local_388.smallend.vect[2] = 0;
                      local_388.bigend.vect[0] = 0x3fe00000;
                      local_388.bigend.vect[1] = 0;
                      local_388.bigend.vect[2] = 0x3ff80000;
                      local_388.btype.itype = 0;
                      uStack_36c = 0x40040000;
                      local_3c8.kstride = 0;
                      local_3c8.nstride = 0;
                      local_3c8.p = (double *)0x0;
                      local_3c8.jstride = 0;
                      local_388.smallend.vect._0_8_ = dVar36;
                      if (0 < (int)uVar25) {
                        uVar34 = 0;
                        do {
                          uVar19 = 0;
                          dVar36 = dVar37;
                          dVar38 = dVar39;
                          do {
                            if (uVar34 != uVar19) {
                              dVar2 = *(double *)(local_388.smallend.vect + uVar19 * 2);
                              dVar36 = dVar36 * (-0.5 - dVar2);
                              dVar38 = dVar38 * (*(double *)(local_388.smallend.vect + uVar34 * 2) -
                                                dVar2);
                            }
                            uVar19 = uVar19 + 1;
                          } while (uVar35 != uVar19);
                          (&local_3c8.p)[uVar34] = (double *)(dVar36 / dVar38);
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != uVar35);
                      }
                      uVar34 = local_508;
                      uVar19 = local_4d8;
                      if (iVar7 <= iVar27) {
                        local_5b0 = (double *)(long)(int)local_5a8;
                        local_588 = (double *)
                                    (local_408.p +
                                    ((long)local_5b0 - (long)local_408.begin.z) * local_408.kstride)
                        ;
                        lVar18 = local_510;
                        do {
                          if ((int)local_570 <= iVar22) {
                            local_568 = local_5f0.p +
                                        (lVar18 - local_5f0.begin.y) * local_5f0.jstride +
                                        local_5f0.nstride * uVar8;
                            lVar23 = ((int)local_5a8 - local_5f0.begin.z) * local_5f0.kstride;
                            lVar13 = local_2b8;
                            do {
                              if (0 < *(int *)((long)local_588 +
                                              (lVar13 - local_408.begin.x) * 4 +
                                              (lVar18 - local_408.begin.y) *
                                              CONCAT44(local_408.jstride._4_4_,
                                                       (uint)local_408.jstride) * 4)) {
                                lVar30 = lVar13 - local_5f0.begin.x;
                                dVar36 = 0.0;
                                if (1 < (int)uVar25) {
                                  uVar34 = 1;
                                  do {
                                    dVar36 = dVar36 + local_568[lVar30 + (((int)local_5a8 -
                                                                          local_5f0.begin.z) +
                                                                         (int)uVar34) *
                                                                         local_5f0.kstride] *
                                                      (double)(&local_3c8.p)[uVar34];
                                    uVar34 = uVar34 + 1;
                                  } while (uVar35 != uVar34);
                                }
                                local_568[lVar23 + lVar30] = dVar36;
                                if (bc_mode == Inhomogeneous) {
                                  local_568[lVar23 + lVar30] =
                                       local_268.p
                                       [(lVar18 - local_268.begin.y) * local_268.jstride +
                                        ((long)local_5b0 - (long)local_268.begin.z) *
                                        local_268.kstride +
                                        local_268.nstride * uVar8 + (lVar13 - local_268.begin.x)] *
                                       (double)local_3c8.p + dVar36;
                                }
                              }
                              lVar13 = lVar13 + 1;
                            } while (local_528 != (int)lVar13);
                          }
                          lVar18 = lVar18 + 1;
                          uVar34 = local_508;
                        } while (local_51c != (int)lVar18);
                      }
                    }
                    else if (iVar5 == 0x66) {
                      if (iVar7 <= iVar27) {
                        lVar13 = CONCAT44(local_408.jstride._4_4_,(uint)local_408.jstride) * 4;
                        lVar23 = (long)local_408.p +
                                 (local_510 - local_408.begin.y) * lVar13 +
                                 ((int)local_5a8 - local_408.begin.z) * local_408.kstride * 4 +
                                 (long)local_408.begin.x * -4 + local_468;
                        lVar18 = local_510;
                        do {
                          if ((int)local_570 <= iVar22) {
                            lVar30 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                            lVar31 = 0;
                            do {
                              if (0 < *(int *)(lVar23 + lVar31 * 4)) {
                                *(undefined8 *)
                                 ((long)local_5f0.p +
                                 lVar31 * 8 +
                                 (long)((int)local_5a8 - local_5f0.begin.z) * local_5f0.kstride * 8
                                 + lVar30 * 8 + local_5f0.nstride * local_580 +
                                 (long)local_5f0.begin.x * -8 + local_430) =
                                     *(undefined8 *)
                                      ((long)local_5f0.p +
                                      lVar31 * 8 +
                                      local_5f0.kstride * 8 * (long)(local_530 - local_5f0.begin.z)
                                      + lVar30 * 8 + local_5f0.nstride * local_580 +
                                      (long)local_5f0.begin.x * -8 + local_430);
                              }
                              lVar31 = lVar31 + 1;
                            } while (iVar26 != (int)lVar31);
                          }
                          lVar18 = lVar18 + 1;
                          lVar23 = lVar23 + lVar13;
                        } while (local_51c != (int)lVar18);
                      }
                    }
                    else if ((iVar5 == 0x67) && (iVar7 <= iVar27)) {
                      lVar13 = CONCAT44(local_408.jstride._4_4_,(uint)local_408.jstride) * 4;
                      lVar23 = (long)local_408.p +
                               (local_510 - local_408.begin.y) * lVar13 +
                               ((int)local_5a8 - local_408.begin.z) * local_408.kstride * 4 +
                               (long)local_408.begin.x * -4 + local_468;
                      lVar18 = local_510;
                      do {
                        if ((int)local_570 <= iVar22) {
                          lVar30 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                          lVar31 = 0;
                          do {
                            if (0 < *(int *)(lVar23 + lVar31 * 4)) {
                              *(ulong *)((long)local_5f0.p +
                                        lVar31 * 8 +
                                        (long)((int)local_5a8 - local_5f0.begin.z) *
                                        local_5f0.kstride * 8 + lVar30 * 8 +
                                        local_5f0.nstride * local_580 + (long)local_5f0.begin.x * -8
                                        + local_430) =
                                   *(ulong *)((long)local_5f0.p +
                                             lVar31 * 8 +
                                             local_5f0.kstride * 8 *
                                             (long)(local_530 - local_5f0.begin.z) + lVar30 * 8 +
                                             local_5f0.nstride * local_580 +
                                             (long)local_5f0.begin.x * -8 + local_430) ^
                                   0x8000000000000000;
                            }
                            lVar31 = lVar31 + 1;
                          } while (iVar26 != (int)lVar31);
                        }
                        lVar18 = lVar18 + 1;
                        lVar23 = lVar23 + lVar13;
                      } while (local_51c != (int)lVar18);
                    }
                    if (iVar16 == 0x65) {
                      dVar36 = -(double)pdVar1 * local_220;
                      local_388.smallend.vect[0] = SUB84(dVar36,0);
                      local_388.smallend.vect[1] = (int)((ulong)dVar36 >> 0x20);
                      local_388.smallend.vect[2] = 0;
                      local_388.bigend.vect[0] = 0x3fe00000;
                      local_388.bigend.vect[1] = 0;
                      local_388.bigend.vect[2] = 0x3ff80000;
                      local_388.btype.itype = 0;
                      uStack_36c = 0x40040000;
                      local_3c8.kstride = 0;
                      local_3c8.nstride = 0;
                      local_3c8.p = (double *)0x0;
                      local_3c8.jstride = 0;
                      local_388.smallend.vect._0_8_ = dVar36;
                      if (0 < (int)uVar25) {
                        uVar34 = 0;
                        do {
                          uVar19 = 0;
                          dVar36 = dVar37;
                          dVar38 = dVar39;
                          do {
                            if (uVar34 != uVar19) {
                              dVar2 = *(double *)(local_388.smallend.vect + uVar19 * 2);
                              dVar36 = dVar36 * (-0.5 - dVar2);
                              dVar38 = dVar38 * (*(double *)(local_388.smallend.vect + uVar34 * 2) -
                                                dVar2);
                            }
                            uVar19 = uVar19 + 1;
                          } while (uVar35 != uVar19);
                          (&local_3c8.p)[uVar34] = (double *)(dVar36 / dVar38);
                          uVar34 = uVar34 + 1;
                        } while (uVar34 != uVar35);
                      }
                      uVar34 = local_508;
                      uVar19 = local_4d8;
                      if ((int)local_590 <= iVar29) {
                        local_5b0 = (double *)
                                    CONCAT44(local_300.jstride._4_4_,(uint)local_300.jstride);
                        local_558 = (int *)(long)(int)local_598;
                        local_588 = (double *)
                                    (local_300.p +
                                    ((long)local_558 - (long)local_300.begin.z) * local_300.kstride)
                        ;
                        local_608 = local_518;
                        do {
                          if (local_600 <= iVar11) {
                            local_568 = local_5f0.p +
                                        (local_608 - local_5f0.begin.y) * local_5f0.jstride +
                                        local_5f0.nstride * uVar8;
                            lVar13 = ((int)local_598 - local_5f0.begin.z) * local_5f0.kstride;
                            lVar18 = local_2c0;
                            do {
                              if (0 < *(int *)((long)local_588 +
                                              (lVar18 - local_300.begin.x) * 4 +
                                              (local_608 - local_300.begin.y) * (long)local_5b0 * 4)
                                 ) {
                                lVar23 = lVar18 - local_5f0.begin.x;
                                dVar37 = 0.0;
                                if (1 < (int)uVar25) {
                                  uVar34 = 1;
                                  iVar5 = local_4b8 - local_5f0.begin.z;
                                  do {
                                    dVar37 = dVar37 + local_568[lVar23 + local_5f0.kstride * iVar5]
                                                      * (double)(&local_3c8.p)[uVar34];
                                    uVar34 = uVar34 + 1;
                                    iVar5 = iVar5 + -1;
                                  } while (uVar35 != uVar34);
                                }
                                local_568[lVar13 + lVar23] = dVar37;
                                if (bc_mode == Inhomogeneous) {
                                  local_568[lVar13 + lVar23] =
                                       local_2a8.p
                                       [(local_608 - local_2a8.begin.y) * local_2a8.jstride +
                                        ((long)local_558 - (long)local_2a8.begin.z) *
                                        local_2a8.kstride +
                                        local_2a8.nstride * uVar8 + (lVar18 - local_2a8.begin.x)] *
                                       (double)local_3c8.p + dVar37;
                                }
                              }
                              lVar18 = lVar18 + 1;
                            } while (local_524 != (int)lVar18);
                          }
                          local_608 = local_608 + 1;
                          uVar34 = local_508;
                        } while (local_520 != (int)local_608);
                      }
                    }
                    else if (iVar16 == 0x66) {
                      if ((int)local_590 <= iVar29) {
                        lVar13 = CONCAT44(local_300.jstride._4_4_,(uint)local_300.jstride) * 4;
                        lVar23 = (long)local_300.p +
                                 (local_518 - local_300.begin.y) * lVar13 +
                                 ((int)local_598 - local_300.begin.z) * local_300.kstride * 4 +
                                 (long)local_300.begin.x * -4 + local_470;
                        lVar18 = local_518;
                        do {
                          if (local_600 <= iVar11) {
                            lVar30 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                            lVar31 = 0;
                            do {
                              if (0 < *(int *)(lVar23 + lVar31 * 4)) {
                                *(undefined8 *)
                                 ((long)local_5f0.p +
                                 lVar31 * 8 +
                                 (long)((int)local_598 - local_5f0.begin.z) * local_5f0.kstride * 8
                                 + lVar30 * 8 + local_5f0.nstride * local_580 +
                                 (long)local_5f0.begin.x * -8 + local_438) =
                                     *(undefined8 *)
                                      ((long)local_5f0.p +
                                      lVar31 * 8 +
                                      local_5f0.kstride * 8 *
                                      (long)(~local_5f0.begin.z + (int)local_598) + lVar30 * 8 +
                                      local_5f0.nstride * local_580 + (long)local_5f0.begin.x * -8 +
                                      local_438);
                              }
                              lVar31 = lVar31 + 1;
                            } while ((int)uVar34 != (int)lVar31);
                          }
                          lVar18 = lVar18 + 1;
                          lVar23 = lVar23 + lVar13;
                        } while (local_520 != (int)lVar18);
                      }
                    }
                    else if ((iVar16 == 0x67) && ((int)local_590 <= iVar29)) {
                      lVar13 = CONCAT44(local_300.jstride._4_4_,(uint)local_300.jstride) * 4;
                      lVar23 = (long)local_300.p +
                               (local_518 - local_300.begin.y) * lVar13 +
                               ((int)local_598 - local_300.begin.z) * local_300.kstride * 4 +
                               (long)local_300.begin.x * -4 + local_470;
                      lVar18 = local_518;
                      do {
                        if (local_600 <= iVar11) {
                          lVar30 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                          lVar31 = 0;
                          do {
                            if (0 < *(int *)(lVar23 + lVar31 * 4)) {
                              *(ulong *)((long)local_5f0.p +
                                        lVar31 * 8 +
                                        (long)((int)local_598 - local_5f0.begin.z) *
                                        local_5f0.kstride * 8 + lVar30 * 8 +
                                        local_5f0.nstride * local_580 + (long)local_5f0.begin.x * -8
                                        + local_438) =
                                   *(ulong *)((long)local_5f0.p +
                                             lVar31 * 8 +
                                             local_5f0.kstride * 8 *
                                             (long)(~local_5f0.begin.z + (int)local_598) +
                                             lVar30 * 8 + local_5f0.nstride * local_580 +
                                             (long)local_5f0.begin.x * -8 + local_438) ^
                                   0x8000000000000000;
                            }
                            lVar31 = lVar31 + 1;
                          } while ((int)uVar34 != (int)lVar31);
                        }
                        lVar18 = lVar18 + 1;
                        lVar23 = lVar23 + lVar13;
                      } while (local_520 != (int)lVar18);
                    }
                  }
                }
              }
              else {
                uStack_560 = 0;
                local_1e8 = pdVar1;
                uStack_1e0 = 0;
                local_568 = pdVar28;
                MultiCutFab::const_array(&local_3c8,(MultiCutFab *)local_a8[local_208],&local_108);
                FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                          (&local_4b0,local_128,&local_108);
                iVar6 = (int)local_5a0;
                iVar16 = (int)local_4f8;
                iVar26 = (int)local_538;
                iVar21 = (int)local_410;
                iVar7 = (int)local_500;
                iVar11 = (int)local_4e0;
                if ((int)local_208 == 1) {
                  if (iVar5 == 0x65) {
                    local_320[0] = -(double)local_568 * local_218;
                    local_320[1] = 0.5;
                    local_320[2] = 1.5;
                    local_320[3] = 2.5;
                    local_338 = 0;
                    uStack_330 = 0;
                    local_348 = 0;
                    uStack_340 = 0;
                    local_358 = 0;
                    uStack_350 = 0;
                    local_368 = 0;
                    uStack_360 = 0;
                    local_388.bigend.vect[1] = 0;
                    local_388.bigend.vect[2] = 0;
                    local_388.btype.itype = 0;
                    uStack_36c = 0;
                    local_388.smallend.vect[0] = 0;
                    local_388.smallend.vect[1] = 0;
                    local_388.smallend.vect[2] = 0;
                    local_388.bigend.vect[0] = 0;
                    if (1 < (int)local_418) {
                      lVar18 = 2;
                      uVar8 = 0;
                      do {
                        lVar13 = 0;
                        do {
                          lVar23 = 0;
                          dVar37 = 1.0;
                          dVar39 = 1.0;
                          do {
                            if (lVar13 != lVar23) {
                              dVar37 = dVar37 * (-0.5 - local_320[lVar23]);
                              dVar39 = dVar39 * (local_320[lVar13] - local_320[lVar23]);
                            }
                            lVar23 = lVar23 + 1;
                          } while (lVar18 != lVar23);
                          *(double *)((long)&local_388 + (uVar8 * 4 + lVar13) * 8) = dVar37 / dVar39
                          ;
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != lVar18);
                        uVar8 = uVar8 + 1;
                        lVar18 = lVar18 + 1;
                      } while (uVar8 != uVar19);
                    }
                    uVar19 = local_4d8;
                    if ((int)local_5a8 <= iVar16) {
                      local_4c8 = (double *)(long)local_4b0.begin.z;
                      local_4d0 = (double *)local_4b0.kstride;
                      local_450 = (double *)
                                  ((long)local_4b0.p +
                                  (iVar6 - local_4b0.begin.y) * local_4b0.jstride * 4);
                      local_440 = (double *)
                                  ((long)local_4b0.p +
                                  (local_52c - local_4b0.begin.y) * local_4b0.jstride * 4);
                      local_5b0 = local_458;
                      do {
                        if ((int)local_570 <= iVar26) {
                          lVar13 = ((long)local_5b0 - (long)local_4c8) * local_4b0.kstride;
                          local_568 = (double *)((long)local_440 + lVar13 * 4);
                          local_588 = (double *)(long)local_3c8.begin.x;
                          local_548 = local_3c8.p +
                                      ((long)local_5b0 - (long)local_3c8.begin.z) *
                                      local_3c8.kstride;
                          lVar23 = (long)local_5f0.begin.x;
                          local_448 = local_5f0.p +
                                      ((long)local_5b0 - (long)local_5f0.begin.z) *
                                      local_5f0.kstride + local_5f0.nstride * local_4c0;
                          lVar30 = (iVar6 - local_5f0.begin.y) * local_5f0.jstride;
                          local_550 = (double *)(long)local_268.begin.x;
                          local_4f0 = local_268.p +
                                      ((long)iVar6 - (long)local_268.begin.y) * local_268.jstride +
                                      ((long)local_5b0 - (long)local_268.begin.z) *
                                      local_268.kstride + local_268.nstride * local_4c0;
                          lVar18 = local_2b8;
                          do {
                            if ((*(int *)((long)local_450 +
                                         (lVar18 - local_4b0.begin.x) * 4 + lVar13 * 4) == 0) &&
                               (*(int *)((long)local_568 + (lVar18 - local_4b0.begin.x) * 4) == 1))
                            {
                              if (1 < (int)uVar25) {
                                uVar19 = 0;
                                bVar33 = false;
                                do {
                                  if (local_548[(lVar18 - (long)local_588) +
                                                ((local_52c - local_3c8.begin.y) + (int)uVar19) *
                                                local_3c8.jstride] <= 0.0) {
                                    uVar8 = (ulong)((int)uVar19 + 1);
                                    break;
                                  }
                                  bVar33 = (bool)(bVar33 | local_548[(lVar18 - (long)local_588) +
                                                                     ((local_52c - local_3c8.begin.y
                                                                      ) + (int)uVar19) *
                                                                     local_3c8.jstride] < 1.0);
                                  uVar19 = uVar19 + 1;
                                  uVar8 = uVar35;
                                } while (local_2b0 != uVar19);
                                uVar10 = (uint)uVar8;
                                uVar24 = 2;
                                if (uVar10 < 2) {
                                  uVar24 = uVar10;
                                }
                                if (!bVar33) {
                                  uVar24 = uVar10;
                                }
                                if (uVar24 != 1) {
                                  lVar31 = lVar18 - lVar23;
                                  uVar34 = 2;
                                  if (2 < uVar24) {
                                    uVar34 = (ulong)uVar24;
                                  }
                                  dVar37 = 0.0;
                                  uVar19 = 1;
                                  do {
                                    dVar37 = dVar37 + local_448[lVar31 + ((iVar6 - local_5f0.begin.y
                                                                          ) + (int)uVar19) *
                                                                         local_5f0.jstride] *
                                                      *(double *)
                                                       (local_388.smallend.vect +
                                                       ((long)(int)(uVar24 * 4 + -8) + uVar19) * 2);
                                    uVar19 = uVar19 + 1;
                                  } while (uVar34 != uVar19);
                                  local_448[lVar30 + lVar31] = dVar37;
                                  uVar34 = local_508;
                                  if (bc_mode == Inhomogeneous) {
                                    local_448[lVar30 + lVar31] =
                                         local_4f0[lVar18 - (long)local_550] *
                                         *(double *)
                                          (local_388.smallend.vect +
                                          (long)(int)(uVar24 * 4 + -8) * 2) + dVar37;
                                  }
                                  goto LAB_006cd9e3;
                                }
                              }
                              if (bc_mode == Inhomogeneous) {
                                local_448[lVar30 + (lVar18 - lVar23)] =
                                     local_4f0[lVar18 - (long)local_550];
                              }
                              else {
                                local_448[lVar30 + (lVar18 - lVar23)] = 0.0;
                              }
                            }
LAB_006cd9e3:
                            lVar18 = lVar18 + 1;
                          } while (local_528 != (int)lVar18);
                        }
                        local_5b0 = (double *)((long)local_5b0 + 1);
                        uVar19 = local_4d8;
                      } while (local_574 != (int)local_5b0);
                    }
                  }
                  else if (iVar5 == 0x66) {
                    if ((int)local_5a8 <= iVar16) {
                      lVar23 = local_4b0.kstride * 4;
                      lVar13 = ((long)local_458 - (long)local_4b0.begin.z) * lVar23;
                      lVar18 = (long)local_4b0.p +
                               (long)(iVar6 - local_4b0.begin.y) * local_4b0.jstride * 4 + lVar13 +
                               (long)local_4b0.begin.x * -4 + local_468;
                      lVar13 = (long)local_4b0.p +
                               local_4b0.jstride * 4 * (long)(local_52c - local_4b0.begin.y) +
                               lVar13 + (long)local_4b0.begin.x * -4 + local_468;
                      pdVar28 = local_458;
                      do {
                        if ((int)local_570 <= iVar26) {
                          lVar31 = ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride;
                          lVar30 = 0;
                          do {
                            if ((*(int *)(lVar18 + lVar30 * 4) == 0) &&
                               (*(int *)(lVar13 + lVar30 * 4) == 1)) {
                              *(undefined8 *)
                               ((long)local_5f0.p +
                               lVar30 * 8 +
                               local_5f0.jstride * 8 * (long)(iVar6 - local_5f0.begin.y) +
                               lVar31 * 8 + local_5f0.nstride * local_580 +
                               (long)local_5f0.begin.x * -8 + local_430) =
                                   *(undefined8 *)
                                    ((long)local_5f0.p +
                                    lVar30 * 8 +
                                    (long)(local_52c - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                    lVar31 * 8 + local_5f0.nstride * local_580 +
                                    (long)local_5f0.begin.x * -8 + local_430);
                            }
                            lVar30 = lVar30 + 1;
                            uVar34 = local_508;
                          } while (iVar21 != (int)lVar30);
                        }
                        pdVar28 = (double *)((long)pdVar28 + 1);
                        lVar18 = lVar18 + lVar23;
                        lVar13 = lVar13 + lVar23;
                      } while (local_574 != (int)pdVar28);
                    }
                  }
                  else if ((iVar5 == 0x67) && ((int)local_5a8 <= iVar16)) {
                    lVar23 = local_4b0.kstride * 4;
                    lVar13 = ((long)local_458 - (long)local_4b0.begin.z) * lVar23;
                    lVar18 = (long)local_4b0.p +
                             (long)(iVar6 - local_4b0.begin.y) * local_4b0.jstride * 4 + lVar13 +
                             (long)local_4b0.begin.x * -4 + local_468;
                    lVar13 = (long)local_4b0.p +
                             local_4b0.jstride * 4 * (long)(local_52c - local_4b0.begin.y) + lVar13
                             + (long)local_4b0.begin.x * -4 + local_468;
                    pdVar28 = local_458;
                    do {
                      if ((int)local_570 <= iVar26) {
                        lVar31 = ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride;
                        lVar30 = 0;
                        do {
                          if ((*(int *)(lVar18 + lVar30 * 4) == 0) &&
                             (*(int *)(lVar13 + lVar30 * 4) == 1)) {
                            *(ulong *)((long)local_5f0.p +
                                      lVar30 * 8 +
                                      local_5f0.jstride * 8 * (long)(iVar6 - local_5f0.begin.y) +
                                      lVar31 * 8 + local_5f0.nstride * local_580 +
                                      (long)local_5f0.begin.x * -8 + local_430) =
                                 *(ulong *)((long)local_5f0.p +
                                           lVar30 * 8 +
                                           (long)(local_52c - local_5f0.begin.y) *
                                           local_5f0.jstride * 8 + lVar31 * 8 +
                                           local_5f0.nstride * local_580 +
                                           (long)local_5f0.begin.x * -8 + local_430) ^
                                 0x8000000000000000;
                          }
                          lVar30 = lVar30 + 1;
                          uVar34 = local_508;
                        } while (iVar21 != (int)lVar30);
                      }
                      pdVar28 = (double *)((long)pdVar28 + 1);
                      lVar18 = lVar18 + lVar23;
                      lVar13 = lVar13 + lVar23;
                    } while (local_574 != (int)pdVar28);
                  }
                  if ((int)local_558 == 0x65) {
                    local_320[0] = -(double)local_1e8 * local_218;
                    local_320[1] = 0.5;
                    local_320[2] = 1.5;
                    local_320[3] = 2.5;
                    local_338 = 0;
                    uStack_330 = 0;
                    local_348 = 0;
                    uStack_340 = 0;
                    local_358 = 0;
                    uStack_350 = 0;
                    local_368 = 0;
                    uStack_360 = 0;
                    local_388.bigend.vect[1] = 0;
                    local_388.bigend.vect[2] = 0;
                    local_388.btype.itype = 0;
                    uStack_36c = 0;
                    local_388.smallend.vect[0] = 0;
                    local_388.smallend.vect[1] = 0;
                    local_388.smallend.vect[2] = 0;
                    local_388.bigend.vect[0] = 0;
                    if (1 < (int)local_418) {
                      lVar18 = 2;
                      uVar34 = 0;
                      do {
                        lVar13 = 0;
                        do {
                          lVar23 = 0;
                          dVar37 = 1.0;
                          dVar39 = 1.0;
                          do {
                            if (lVar13 != lVar23) {
                              dVar37 = dVar37 * (-0.5 - local_320[lVar23]);
                              dVar39 = dVar39 * (local_320[lVar13] - local_320[lVar23]);
                            }
                            lVar23 = lVar23 + 1;
                          } while (lVar18 != lVar23);
                          *(double *)((long)&local_388 + (uVar34 * 4 + lVar13) * 8) =
                               dVar37 / dVar39;
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != lVar18);
                        uVar34 = uVar34 + 1;
                        lVar18 = lVar18 + 1;
                      } while (uVar34 != uVar19);
                    }
                    uVar34 = local_508;
                    uVar19 = local_4d8;
                    local_388.smallend.vect._0_8_ =
                         CONCAT44(local_388.smallend.vect[1],local_388.smallend.vect[0]);
                    if ((int)local_598 <= iVar7) {
                      local_4c8 = (double *)(long)local_4b0.begin.z;
                      local_4d0 = (double *)local_4b0.kstride;
                      local_450 = (double *)
                                  ((long)local_4b0.p +
                                  ((int)local_590 - local_4b0.begin.y) * local_4b0.jstride * 4);
                      local_440 = (double *)
                                  ((long)local_4b0.p +
                                  (~local_4b0.begin.y + (int)local_590) * local_4b0.jstride * 4);
                      lVar18 = local_460;
                      do {
                        if (local_600 <= iVar11) {
                          lVar23 = (lVar18 - (long)local_4c8) * local_4b0.kstride;
                          local_568 = (double *)((long)local_440 + lVar23 * 4);
                          local_558 = (int *)(long)local_3c8.begin.x;
                          local_5b0 = local_3c8.p + (lVar18 - local_3c8.begin.z) * local_3c8.kstride
                          ;
                          lVar30 = (long)local_5f0.begin.x;
                          local_550 = local_5f0.p +
                                      (lVar18 - local_5f0.begin.z) * local_5f0.kstride +
                                      local_5f0.nstride * local_4c0;
                          lVar31 = ((int)local_590 - local_5f0.begin.y) * local_5f0.jstride;
                          local_588 = (double *)(long)local_2a8.begin.x;
                          local_548 = local_2a8.p +
                                      ((long)(int)local_590 - (long)local_2a8.begin.y) *
                                      local_2a8.jstride +
                                      (lVar18 - local_2a8.begin.z) * local_2a8.kstride +
                                      local_2a8.nstride * local_4c0;
                          local_448 = (double *)
                                      CONCAT44(local_448._4_4_,local_4b4 - local_5f0.begin.y);
                          local_4f0 = (double *)
                                      CONCAT44(local_4f0._4_4_,(int)local_590 - local_3c8.begin.y);
                          lVar13 = local_2c0;
                          do {
                            if ((*(int *)((long)local_450 +
                                         (lVar13 - local_4b0.begin.x) * 4 + lVar23 * 4) == 0) &&
                               (*(int *)((long)local_568 + (lVar13 - local_4b0.begin.x) * 4) == 1))
                            {
                              if (1 < (int)uVar25) {
                                uVar34 = 0;
                                bVar33 = false;
                                iVar5 = (int)local_590 - local_3c8.begin.y;
                                do {
                                  if (local_5b0[(lVar13 - (long)local_558) +
                                                iVar5 * local_3c8.jstride] <= 0.0) {
                                    uVar19 = (ulong)((int)uVar34 + 1);
                                    break;
                                  }
                                  bVar33 = (bool)(bVar33 | local_5b0[(lVar13 - (long)local_558) +
                                                                     iVar5 * local_3c8.jstride] <
                                                           1.0);
                                  uVar34 = uVar34 + 1;
                                  iVar5 = iVar5 + -1;
                                  uVar19 = uVar35;
                                } while (local_2b0 != uVar34);
                                uVar10 = (uint)uVar19;
                                uVar24 = 2;
                                if (uVar10 < 2) {
                                  uVar24 = uVar10;
                                }
                                if (!bVar33) {
                                  uVar24 = uVar10;
                                }
                                if (uVar24 != 1) {
                                  lVar32 = lVar13 - lVar30;
                                  uVar34 = 2;
                                  if (2 < uVar24) {
                                    uVar34 = (ulong)uVar24;
                                  }
                                  dVar37 = 0.0;
                                  uVar19 = 1;
                                  iVar5 = local_4b4 - local_5f0.begin.y;
                                  do {
                                    dVar37 = dVar37 + local_550[lVar32 + local_5f0.jstride * iVar5]
                                                      * *(double *)
                                                         (local_388.smallend.vect +
                                                         ((long)(int)(uVar24 * 4 + -8) + uVar19) * 2
                                                         );
                                    uVar19 = uVar19 + 1;
                                    iVar5 = iVar5 + -1;
                                  } while (uVar34 != uVar19);
                                  local_550[lVar31 + lVar32] = dVar37;
                                  if (bc_mode == Inhomogeneous) {
                                    local_550[lVar31 + lVar32] =
                                         local_548[lVar13 - (long)local_588] *
                                         *(double *)
                                          (local_388.smallend.vect +
                                          (long)(int)(uVar24 * 4 + -8) * 2) + dVar37;
                                  }
                                  goto LAB_006ce1cc;
                                }
                              }
                              if (bc_mode == Inhomogeneous) {
                                local_550[lVar31 + (lVar13 - lVar30)] =
                                     local_548[lVar13 - (long)local_588];
                              }
                              else {
                                local_550[lVar31 + (lVar13 - lVar30)] = 0.0;
                              }
                            }
LAB_006ce1cc:
                            lVar13 = lVar13 + 1;
                          } while (local_524 != (int)lVar13);
                        }
                        lVar18 = lVar18 + 1;
                        uVar34 = local_508;
                        uVar19 = local_4d8;
                        local_388.smallend.vect._0_8_ =
                             CONCAT44(local_388.smallend.vect[1],local_388.smallend.vect[0]);
                      } while (local_578 != (int)lVar18);
                    }
                  }
                  else if ((int)local_558 == 0x66) {
                    if ((int)local_598 <= iVar7) {
                      lVar30 = local_4b0.kstride * 4;
                      lVar18 = (local_460 - local_4b0.begin.z) * lVar30;
                      lVar13 = (long)local_4b0.p +
                               (long)((int)local_590 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                               lVar18 + (long)local_4b0.begin.x * -4 + local_470;
                      lVar23 = (long)local_4b0.p +
                               local_4b0.jstride * 4 * (long)(local_4b4 - local_4b0.begin.y) +
                               lVar18 + (long)local_4b0.begin.x * -4 + local_470;
                      lVar18 = local_460;
                      do {
                        if (local_600 <= iVar11) {
                          lVar32 = (lVar18 - local_5f0.begin.z) * local_5f0.kstride;
                          lVar31 = 0;
                          do {
                            if ((*(int *)(lVar13 + lVar31 * 4) == 0) &&
                               (*(int *)(lVar23 + lVar31 * 4) == 1)) {
                              *(undefined8 *)
                               ((long)local_5f0.p +
                               lVar31 * 8 +
                               local_5f0.jstride * 8 * (long)((int)local_590 - local_5f0.begin.y) +
                               lVar32 * 8 + local_5f0.nstride * local_580 +
                               (long)local_5f0.begin.x * -8 + local_438) =
                                   *(undefined8 *)
                                    ((long)local_5f0.p +
                                    lVar31 * 8 +
                                    (long)(local_4b4 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                    lVar32 * 8 + local_5f0.nstride * local_580 +
                                    (long)local_5f0.begin.x * -8 + local_438);
                            }
                            lVar31 = lVar31 + 1;
                            uVar34 = local_508;
                          } while ((int)local_508 != (int)lVar31);
                        }
                        lVar18 = lVar18 + 1;
                        lVar13 = lVar13 + lVar30;
                        lVar23 = lVar23 + lVar30;
                      } while (local_578 != (int)lVar18);
                    }
                  }
                  else if (((int)local_558 == 0x67) && ((int)local_598 <= iVar7)) {
                    lVar30 = local_4b0.kstride * 4;
                    lVar18 = (local_460 - local_4b0.begin.z) * lVar30;
                    lVar13 = (long)local_4b0.p +
                             (long)((int)local_590 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                             lVar18 + (long)local_4b0.begin.x * -4 + local_470;
                    lVar23 = (long)local_4b0.p +
                             local_4b0.jstride * 4 * (long)(local_4b4 - local_4b0.begin.y) + lVar18
                             + (long)local_4b0.begin.x * -4 + local_470;
                    lVar18 = local_460;
                    do {
                      if (local_600 <= iVar11) {
                        lVar32 = (lVar18 - local_5f0.begin.z) * local_5f0.kstride;
                        lVar31 = 0;
                        do {
                          if ((*(int *)(lVar13 + lVar31 * 4) == 0) &&
                             (*(int *)(lVar23 + lVar31 * 4) == 1)) {
                            *(ulong *)((long)local_5f0.p +
                                      lVar31 * 8 +
                                      local_5f0.jstride * 8 *
                                      (long)((int)local_590 - local_5f0.begin.y) + lVar32 * 8 +
                                      local_5f0.nstride * local_580 + (long)local_5f0.begin.x * -8 +
                                      local_438) =
                                 *(ulong *)((long)local_5f0.p +
                                           lVar31 * 8 +
                                           (long)(local_4b4 - local_5f0.begin.y) *
                                           local_5f0.jstride * 8 + lVar32 * 8 +
                                           local_5f0.nstride * local_580 +
                                           (long)local_5f0.begin.x * -8 + local_438) ^
                                 0x8000000000000000;
                          }
                          lVar31 = lVar31 + 1;
                          uVar34 = local_508;
                        } while ((int)local_508 != (int)lVar31);
                      }
                      lVar18 = lVar18 + 1;
                      lVar13 = lVar13 + lVar30;
                      lVar23 = lVar23 + lVar30;
                    } while (local_578 != (int)lVar18);
                  }
                }
                else {
                  dVar37 = 1.0;
                  dVar39 = 1.0;
                  iVar29 = (int)local_540;
                  iVar22 = (int)local_4e8;
                  if ((int)local_208 == 0) {
                    if (iVar5 == 0x65) {
                      local_320[0] = -(double)local_568 * local_210;
                      local_320[1] = 0.5;
                      local_320[2] = 1.5;
                      local_320[3] = 2.5;
                      local_338 = 0;
                      uStack_330 = 0;
                      local_348 = 0;
                      uStack_340 = 0;
                      local_358 = 0;
                      uStack_350 = 0;
                      local_368 = 0;
                      uStack_360 = 0;
                      local_388.bigend.vect[1] = 0;
                      local_388.bigend.vect[2] = 0;
                      local_388.btype.itype = 0;
                      uStack_36c = 0;
                      local_388.smallend.vect[0] = 0;
                      local_388.smallend.vect[1] = 0;
                      local_388.smallend.vect[2] = 0;
                      local_388.bigend.vect[0] = 0;
                      if (1 < (int)local_418) {
                        lVar18 = 2;
                        uVar34 = 0;
                        do {
                          lVar13 = 0;
                          do {
                            lVar23 = 0;
                            dVar36 = dVar37;
                            dVar38 = dVar39;
                            do {
                              if (lVar13 != lVar23) {
                                dVar36 = dVar36 * (-0.5 - local_320[lVar23]);
                                dVar38 = dVar38 * (local_320[lVar13] - local_320[lVar23]);
                              }
                              lVar23 = lVar23 + 1;
                            } while (lVar18 != lVar23);
                            *(double *)((long)&local_388 + (uVar34 * 4 + lVar13) * 8) =
                                 dVar36 / dVar38;
                            lVar13 = lVar13 + 1;
                          } while (lVar13 != lVar18);
                          uVar34 = uVar34 + 1;
                          lVar18 = lVar18 + 1;
                        } while (uVar34 != uVar19);
                      }
                      uVar34 = local_508;
                      uVar19 = local_4d8;
                      if ((int)local_5a8 <= iVar16) {
                        local_130 = (long)local_4b0.begin.z;
                        local_138 = (double *)local_4b0.kstride;
                        local_4d0 = (double *)(long)(local_424 - local_4b0.begin.x);
                        local_5b0 = local_458;
                        local_450 = (double *)local_4b0.p;
                        do {
                          if (iVar6 <= iVar29) {
                            lVar23 = ((long)local_5b0 - (long)local_4b0.begin.z) * local_4b0.kstride
                            ;
                            local_548 = (double *)(long)local_3c8.begin.y;
                            local_588 = local_3c8.p +
                                        ((long)local_5b0 - (long)local_3c8.begin.z) *
                                        local_3c8.kstride;
                            local_550 = (double *)local_3c8.jstride;
                            lVar13 = (long)local_5f0.begin.y;
                            local_440 = local_5f0.p +
                                        ((long)local_5b0 - (long)local_5f0.begin.z) *
                                        local_5f0.kstride + local_5f0.nstride * local_4c0;
                            local_568 = local_440 + ((int)local_570 - local_5f0.begin.x);
                            local_4f0 = (double *)(long)local_268.begin.y;
                            local_448 = (double *)local_268.jstride;
                            local_4c8 = local_268.p +
                                        ((long)(int)local_570 - (long)local_268.begin.x) +
                                        ((long)local_5b0 - (long)local_268.begin.z) *
                                        local_268.kstride + local_268.nstride * local_4c0;
                            lVar18 = local_510;
                            do {
                              lVar30 = (lVar18 - local_4b0.begin.y) * local_4b0.jstride;
                              if ((*(int *)((long)local_4b0.p +
                                           lVar23 * 4 +
                                           (long)((int)local_570 - local_4b0.begin.x) * 4 +
                                           lVar30 * 4) == 0) &&
                                 (*(int *)((long)local_4b0.p +
                                          lVar23 * 4 + (long)local_4d0 * 4 + lVar30 * 4) == 1)) {
                                if (1 < (int)uVar25) {
                                  uVar34 = 0;
                                  bVar33 = false;
                                  do {
                                    if (local_588[(lVar18 - (long)local_548) * local_3c8.jstride +
                                                  (long)((local_424 - local_3c8.begin.x) +
                                                        (int)uVar34)] <= 0.0) {
                                      uVar19 = (ulong)((int)uVar34 + 1);
                                      break;
                                    }
                                    bVar33 = (bool)(bVar33 | local_588[(lVar18 - (long)local_548) *
                                                                       local_3c8.jstride +
                                                                       (long)((local_424 -
                                                                              local_3c8.begin.x) +
                                                                             (int)uVar34)] < 1.0);
                                    uVar34 = uVar34 + 1;
                                    uVar19 = uVar35;
                                  } while (local_2b0 != uVar34);
                                  uVar10 = (uint)uVar19;
                                  uVar24 = 2;
                                  if (uVar10 < 2) {
                                    uVar24 = uVar10;
                                  }
                                  if (!bVar33) {
                                    uVar24 = uVar10;
                                  }
                                  if (uVar24 != 1) {
                                    lVar30 = (lVar18 - lVar13) * local_5f0.jstride;
                                    uVar34 = 2;
                                    if (2 < uVar24) {
                                      uVar34 = (ulong)uVar24;
                                    }
                                    dVar36 = 0.0;
                                    uVar19 = 1;
                                    do {
                                      dVar36 = dVar36 + local_440[lVar30 + (((int)local_570 -
                                                                            local_5f0.begin.x) +
                                                                           (int)uVar19)] *
                                                        *(double *)
                                                         (local_388.smallend.vect +
                                                         ((long)(int)(uVar24 * 4 + -8) + uVar19) * 2
                                                         );
                                      uVar19 = uVar19 + 1;
                                    } while (uVar34 != uVar19);
                                    local_568[lVar30] = dVar36;
                                    if (bc_mode == Inhomogeneous) {
                                      local_568[lVar30] =
                                           local_4c8[(lVar18 - (long)local_4f0) * local_268.jstride]
                                           * *(double *)
                                              (local_388.smallend.vect +
                                              (long)(int)(uVar24 * 4 + -8) * 2) + dVar36;
                                    }
                                    goto LAB_006ccd56;
                                  }
                                }
                                if (bc_mode == Inhomogeneous) {
                                  local_568[(lVar18 - lVar13) * local_5f0.jstride] =
                                       local_4c8[(lVar18 - (long)local_4f0) * local_268.jstride];
                                }
                                else {
                                  local_568[(lVar18 - lVar13) * local_5f0.jstride] = 0.0;
                                }
                              }
LAB_006ccd56:
                              lVar18 = lVar18 + 1;
                            } while (local_51c != (int)lVar18);
                          }
                          local_5b0 = (double *)((long)local_5b0 + 1);
                          uVar34 = local_508;
                          uVar19 = local_4d8;
                        } while (local_574 != (int)local_5b0);
                      }
                    }
                    else if (iVar5 == 0x66) {
                      if ((int)local_5a8 <= iVar16) {
                        lVar13 = local_4b0.kstride * 4;
                        lVar18 = ((long)local_458 - (long)local_4b0.begin.z) * lVar13 +
                                 (local_510 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                                 (long)local_4b0.begin.x * -4;
                        lVar23 = (long)local_4b0.p + lVar18 + local_1c0;
                        lVar18 = (long)local_4b0.p + lVar18 + local_468;
                        pdVar28 = local_458;
                        do {
                          if (iVar6 <= iVar29) {
                            lVar30 = local_5f0.nstride * local_580 +
                                     (local_510 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                     ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride *
                                     8 + (long)local_5f0.begin.x * -8 + (long)local_5f0.p;
                            lVar31 = 0;
                            iVar5 = local_41c;
                            do {
                              if ((*(int *)(lVar18 + lVar31) == 0) &&
                                 (*(int *)(lVar23 + lVar31) == 1)) {
                                *(undefined8 *)(lVar30 + local_2b8 * 8) =
                                     *(undefined8 *)(lVar30 + local_1b0 * 8);
                              }
                              lVar30 = lVar30 + local_5f0.jstride * 8;
                              lVar31 = lVar31 + local_4b0.jstride * 4;
                              iVar5 = iVar5 + -1;
                            } while (iVar5 != 0);
                          }
                          pdVar28 = (double *)((long)pdVar28 + 1);
                          lVar23 = lVar23 + lVar13;
                          lVar18 = lVar18 + lVar13;
                        } while (local_574 != (int)pdVar28);
                      }
                    }
                    else if ((iVar5 == 0x67) && ((int)local_5a8 <= iVar16)) {
                      lVar13 = local_4b0.kstride * 4;
                      lVar18 = ((long)local_458 - (long)local_4b0.begin.z) * lVar13 +
                               (local_510 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                               (long)local_4b0.begin.x * -4;
                      lVar23 = (long)local_4b0.p + lVar18 + local_1c0;
                      lVar18 = (long)local_4b0.p + lVar18 + local_468;
                      pdVar28 = local_458;
                      do {
                        if (iVar6 <= iVar29) {
                          lVar30 = local_5f0.nstride * local_580 +
                                   (local_510 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                   ((long)pdVar28 - (long)local_5f0.begin.z) * local_5f0.kstride * 8
                                   + (long)local_5f0.begin.x * -8 + (long)local_5f0.p;
                          lVar31 = 0;
                          iVar5 = local_41c;
                          do {
                            if ((*(int *)(lVar18 + lVar31) == 0) && (*(int *)(lVar23 + lVar31) == 1)
                               ) {
                              *(ulong *)(lVar30 + local_2b8 * 8) =
                                   *(ulong *)(lVar30 + local_1b0 * 8) ^ 0x8000000000000000;
                            }
                            lVar30 = lVar30 + local_5f0.jstride * 8;
                            lVar31 = lVar31 + local_4b0.jstride * 4;
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                        }
                        pdVar28 = (double *)((long)pdVar28 + 1);
                        lVar23 = lVar23 + lVar13;
                        lVar18 = lVar18 + lVar13;
                      } while (local_574 != (int)pdVar28);
                    }
                    if ((int)local_558 == 0x65) {
                      local_320[0] = -(double)local_1e8 * local_210;
                      local_320[1] = 0.5;
                      local_320[2] = 1.5;
                      local_320[3] = 2.5;
                      local_338 = 0;
                      uStack_330 = 0;
                      local_348 = 0;
                      uStack_340 = 0;
                      local_358 = 0;
                      uStack_350 = 0;
                      local_368 = 0;
                      uStack_360 = 0;
                      local_388.bigend.vect[1] = 0;
                      local_388.bigend.vect[2] = 0;
                      local_388.btype.itype = 0;
                      uStack_36c = 0;
                      local_388.smallend.vect[0] = 0;
                      local_388.smallend.vect[1] = 0;
                      local_388.smallend.vect[2] = 0;
                      local_388.bigend.vect[0] = 0;
                      if (1 < (int)local_418) {
                        lVar18 = 2;
                        uVar8 = 0;
                        do {
                          lVar13 = 0;
                          do {
                            lVar23 = 0;
                            dVar36 = dVar37;
                            dVar38 = dVar39;
                            do {
                              if (lVar13 != lVar23) {
                                dVar36 = dVar36 * (-0.5 - local_320[lVar23]);
                                dVar38 = dVar38 * (local_320[lVar13] - local_320[lVar23]);
                              }
                              lVar23 = lVar23 + 1;
                            } while (lVar18 != lVar23);
                            *(double *)((long)&local_388 + (uVar8 * 4 + lVar13) * 8) =
                                 dVar36 / dVar38;
                            lVar13 = lVar13 + 1;
                          } while (lVar13 != lVar18);
                          uVar8 = uVar8 + 1;
                          lVar18 = lVar18 + 1;
                        } while (uVar8 != uVar19);
                      }
                      uVar19 = local_4d8;
                      local_388.smallend.vect._0_8_ =
                           CONCAT44(local_388.smallend.vect[1],local_388.smallend.vect[0]);
                      if ((int)local_598 <= iVar7) {
                        local_440 = (double *)(long)local_4b0.begin.z;
                        local_1e8 = (double *)local_4b0.kstride;
                        local_5b0 = (double *)(long)(~local_4b0.begin.x + local_600);
                        lVar18 = local_460;
                        do {
                          if ((int)local_590 <= iVar22) {
                            lVar30 = (lVar18 - (long)local_440) * local_4b0.kstride;
                            local_558 = (int *)(long)local_3c8.begin.y;
                            local_588 = (double *)local_3c8.jstride;
                            local_548 = local_3c8.p +
                                        (lVar18 - local_3c8.begin.z) * local_3c8.kstride;
                            lVar23 = (long)local_5f0.begin.y;
                            local_4d0 = local_5f0.p +
                                        (lVar18 - local_5f0.begin.z) * local_5f0.kstride +
                                        local_5f0.nstride * local_4c0;
                            local_568 = local_4d0 + (local_600 - local_5f0.begin.x);
                            local_550 = (double *)(long)local_2a8.begin.y;
                            local_4f0 = (double *)local_2a8.jstride;
                            local_448 = (double *)
                                        CONCAT44(local_448._4_4_,local_600 - local_3c8.begin.x);
                            local_4c8 = local_2a8.p +
                                        ((long)local_600 - (long)local_2a8.begin.x) +
                                        (lVar18 - local_2a8.begin.z) * local_2a8.kstride +
                                        local_2a8.nstride * local_4c0;
                            local_450 = (double *)
                                        CONCAT44(local_450._4_4_,local_224 - local_5f0.begin.x);
                            lVar13 = local_518;
                            do {
                              lVar31 = (lVar13 - local_4b0.begin.y) * local_4b0.jstride;
                              if ((*(int *)((long)local_4b0.p +
                                           lVar30 * 4 +
                                           (long)(local_600 - local_4b0.begin.x) * 4 + lVar31 * 4)
                                   == 0) &&
                                 (*(int *)((long)local_4b0.p +
                                          lVar30 * 4 + (long)local_5b0 * 4 + lVar31 * 4) == 1)) {
                                if (1 < (int)uVar25) {
                                  uVar19 = 0;
                                  bVar33 = false;
                                  iVar5 = local_600 - local_3c8.begin.x;
                                  do {
                                    if (local_548[(lVar13 - (long)local_558) * local_3c8.jstride +
                                                  (long)iVar5] <= 0.0) {
                                      uVar24 = (int)uVar19 + 1;
                                      break;
                                    }
                                    bVar33 = (bool)(bVar33 | local_548[(lVar13 - (long)local_558) *
                                                                       local_3c8.jstride +
                                                                       (long)iVar5] < 1.0);
                                    uVar19 = uVar19 + 1;
                                    iVar5 = iVar5 + -1;
                                    uVar24 = uVar25;
                                  } while (local_2b0 != uVar19);
                                  uVar10 = 2;
                                  if (uVar24 < 2) {
                                    uVar10 = uVar24;
                                  }
                                  if (!bVar33) {
                                    uVar10 = uVar24;
                                  }
                                  if (uVar10 != 1) {
                                    lVar31 = (lVar13 - lVar23) * local_5f0.jstride;
                                    uVar34 = 2;
                                    if (2 < uVar10) {
                                      uVar34 = (ulong)uVar10;
                                    }
                                    dVar37 = 0.0;
                                    uVar19 = 1;
                                    iVar5 = local_224 - local_5f0.begin.x;
                                    do {
                                      dVar37 = dVar37 + local_4d0[lVar31 + iVar5] *
                                                        *(double *)
                                                         (local_388.smallend.vect +
                                                         ((long)(int)(uVar10 * 4 + -8) + uVar19) * 2
                                                         );
                                      uVar19 = uVar19 + 1;
                                      iVar5 = iVar5 + -1;
                                    } while (uVar34 != uVar19);
                                    local_568[lVar31] = dVar37;
                                    uVar34 = local_508;
                                    if (bc_mode == Inhomogeneous) {
                                      local_568[lVar31] =
                                           local_4c8[(lVar13 - (long)local_550) * local_2a8.jstride]
                                           * *(double *)
                                              (local_388.smallend.vect +
                                              (long)(int)(uVar10 * 4 + -8) * 2) + dVar37;
                                    }
                                    goto LAB_006cd52a;
                                  }
                                }
                                if (bc_mode == Inhomogeneous) {
                                  local_568[(lVar13 - lVar23) * local_5f0.jstride] =
                                       local_4c8[(lVar13 - (long)local_550) * local_2a8.jstride];
                                }
                                else {
                                  local_568[(lVar13 - lVar23) * local_5f0.jstride] = 0.0;
                                }
                              }
LAB_006cd52a:
                              lVar13 = lVar13 + 1;
                            } while (local_520 != (int)lVar13);
                          }
                          lVar18 = lVar18 + 1;
                          uVar19 = local_4d8;
                          local_388.smallend.vect._0_8_ =
                               CONCAT44(local_388.smallend.vect[1],local_388.smallend.vect[0]);
                        } while (local_578 != (int)lVar18);
                      }
                    }
                    else if ((int)local_558 == 0x66) {
                      if ((int)local_598 <= iVar7) {
                        lVar23 = local_4b0.kstride * 4;
                        lVar18 = (local_460 - local_4b0.begin.z) * lVar23 +
                                 (local_518 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                                 (long)local_4b0.begin.x * -4;
                        lVar30 = (long)local_4b0.p + lVar18 + local_1c8;
                        lVar13 = (long)local_4b0.p + lVar18 + local_470;
                        lVar18 = local_460;
                        do {
                          if ((int)local_590 <= iVar22) {
                            lVar31 = local_5f0.nstride * local_580 +
                                     (local_518 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                     (lVar18 - local_5f0.begin.z) * local_5f0.kstride * 8 +
                                     (long)local_5f0.begin.x * -8 + (long)local_5f0.p;
                            lVar32 = 0;
                            iVar5 = local_420;
                            do {
                              if ((*(int *)(lVar13 + lVar32) == 0) &&
                                 (*(int *)(lVar30 + lVar32) == 1)) {
                                *(undefined8 *)(lVar31 + local_2c0 * 8) =
                                     *(undefined8 *)(lVar31 + local_1b8 * 8);
                              }
                              lVar31 = lVar31 + local_5f0.jstride * 8;
                              lVar32 = lVar32 + local_4b0.jstride * 4;
                              iVar5 = iVar5 + -1;
                            } while (iVar5 != 0);
                          }
                          lVar18 = lVar18 + 1;
                          lVar30 = lVar30 + lVar23;
                          lVar13 = lVar13 + lVar23;
                        } while (local_578 != (int)lVar18);
                      }
                    }
                    else if (((int)local_558 == 0x67) && ((int)local_598 <= iVar7)) {
                      lVar23 = local_4b0.kstride * 4;
                      lVar18 = (local_460 - local_4b0.begin.z) * lVar23 +
                               (local_518 - local_4b0.begin.y) * local_4b0.jstride * 4 +
                               (long)local_4b0.begin.x * -4;
                      lVar30 = (long)local_4b0.p + lVar18 + local_1c8;
                      lVar13 = (long)local_4b0.p + lVar18 + local_470;
                      lVar18 = local_460;
                      do {
                        if ((int)local_590 <= iVar22) {
                          lVar31 = local_5f0.nstride * local_580 +
                                   (local_518 - local_5f0.begin.y) * local_5f0.jstride * 8 +
                                   (lVar18 - local_5f0.begin.z) * local_5f0.kstride * 8 +
                                   (long)local_5f0.begin.x * -8 + (long)local_5f0.p;
                          lVar32 = 0;
                          iVar5 = local_420;
                          do {
                            if ((*(int *)(lVar13 + lVar32) == 0) && (*(int *)(lVar30 + lVar32) == 1)
                               ) {
                              *(ulong *)(lVar31 + local_2c0 * 8) =
                                   *(ulong *)(lVar31 + local_1b8 * 8) ^ 0x8000000000000000;
                            }
                            lVar31 = lVar31 + local_5f0.jstride * 8;
                            lVar32 = lVar32 + local_4b0.jstride * 4;
                            iVar5 = iVar5 + -1;
                          } while (iVar5 != 0);
                        }
                        lVar18 = lVar18 + 1;
                        lVar30 = lVar30 + lVar23;
                        lVar13 = lVar13 + lVar23;
                      } while (local_578 != (int)lVar18);
                    }
                  }
                  else {
                    if (iVar5 == 0x65) {
                      local_320[0] = -(double)local_568 * local_220;
                      local_320[1] = 0.5;
                      local_320[2] = 1.5;
                      local_320[3] = 2.5;
                      local_338 = 0;
                      uStack_330 = 0;
                      local_348 = 0;
                      uStack_340 = 0;
                      local_358 = 0;
                      uStack_350 = 0;
                      local_368 = 0;
                      uStack_360 = 0;
                      local_388.bigend.vect[1] = 0;
                      local_388.bigend.vect[2] = 0;
                      local_388.btype.itype = 0;
                      uStack_36c = 0;
                      local_388.smallend.vect[0] = 0;
                      local_388.smallend.vect[1] = 0;
                      local_388.smallend.vect[2] = 0;
                      local_388.bigend.vect[0] = 0;
                      if (1 < (int)local_418) {
                        lVar18 = 2;
                        uVar34 = 0;
                        do {
                          lVar13 = 0;
                          do {
                            lVar23 = 0;
                            dVar36 = dVar37;
                            dVar38 = dVar39;
                            do {
                              if (lVar13 != lVar23) {
                                dVar36 = dVar36 * (-0.5 - local_320[lVar23]);
                                dVar38 = dVar38 * (local_320[lVar13] - local_320[lVar23]);
                              }
                              lVar23 = lVar23 + 1;
                            } while (lVar18 != lVar23);
                            *(double *)((long)&local_388 + (uVar34 * 4 + lVar13) * 8) =
                                 dVar36 / dVar38;
                            lVar13 = lVar13 + 1;
                          } while (lVar13 != lVar18);
                          uVar34 = uVar34 + 1;
                          lVar18 = lVar18 + 1;
                        } while (uVar34 != uVar19);
                      }
                      uVar34 = local_508;
                      uVar19 = local_4d8;
                      if (iVar6 <= iVar29) {
                        local_4d0 = (double *)local_4b0.p;
                        local_450 = (double *)local_4b0.jstride;
                        local_440 = (double *)(long)local_4b0.begin.y;
                        local_4c8 = (double *)((local_530 - local_4b0.begin.z) * local_4b0.kstride);
                        local_5f8 = local_510;
                        do {
                          if ((int)local_570 <= iVar26) {
                            local_5b0 = (double *)(long)local_3c8.begin.x;
                            local_588 = local_3c8.p +
                                        (local_5f8 - local_3c8.begin.y) * local_3c8.jstride;
                            lVar13 = (long)local_5f0.begin.x;
                            local_448 = local_5f0.p +
                                        (local_5f8 - local_5f0.begin.y) * local_5f0.jstride +
                                        local_5f0.nstride * local_4c0;
                            local_568 = local_448 +
                                        ((int)local_5a8 - local_5f0.begin.z) * local_5f0.kstride;
                            local_548 = (double *)(long)local_268.begin.x;
                            local_550 = local_268.p +
                                        (local_5f8 - local_268.begin.y) * local_268.jstride +
                                        ((long)(int)local_5a8 - (long)local_268.begin.z) *
                                        local_268.kstride + local_268.nstride * local_4c0;
                            lVar18 = local_2b8;
                            do {
                              lVar23 = (lVar18 - local_4b0.begin.x) * 4 +
                                       (local_5f8 - (long)local_440) * local_4b0.jstride * 4;
                              if ((*(int *)((long)local_4b0.p +
                                           ((int)local_5a8 - local_4b0.begin.z) * local_4b0.kstride
                                           * 4 + lVar23) == 0) &&
                                 (*(int *)((long)local_4b0.p + (long)local_4c8 * 4 + lVar23) == 1))
                              {
                                if (1 < (int)uVar25) {
                                  uVar34 = 0;
                                  bVar33 = false;
                                  do {
                                    if (local_588[(lVar18 - (long)local_5b0) +
                                                  ((int)uVar34 + (local_530 - local_3c8.begin.z)) *
                                                  local_3c8.kstride] <= 0.0) {
                                      uVar19 = (ulong)((int)uVar34 + 1);
                                      break;
                                    }
                                    bVar33 = (bool)(bVar33 | local_588[(lVar18 - (long)local_5b0) +
                                                                       ((int)uVar34 +
                                                                       (local_530 -
                                                                       local_3c8.begin.z)) *
                                                                       local_3c8.kstride] < 1.0);
                                    uVar34 = uVar34 + 1;
                                    uVar19 = uVar35;
                                  } while (local_2b0 != uVar34);
                                  uVar10 = (uint)uVar19;
                                  uVar24 = 2;
                                  if (uVar10 < 2) {
                                    uVar24 = uVar10;
                                  }
                                  if (!bVar33) {
                                    uVar24 = uVar10;
                                  }
                                  if (uVar24 != 1) {
                                    local_4f0 = (double *)(lVar18 - lVar13);
                                    uVar34 = 2;
                                    if (2 < uVar24) {
                                      uVar34 = (ulong)uVar24;
                                    }
                                    dVar36 = 0.0;
                                    uVar19 = 1;
                                    do {
                                      dVar36 = dVar36 + local_448[(long)((long)local_4f0 +
                                                                        (((int)local_5a8 -
                                                                         local_5f0.begin.z) +
                                                                        (int)uVar19) *
                                                                        local_5f0.kstride)] *
                                                        *(double *)
                                                         (local_388.smallend.vect +
                                                         ((long)(int)(uVar24 * 4 + -8) + uVar19) * 2
                                                         );
                                      uVar19 = uVar19 + 1;
                                    } while (uVar34 != uVar19);
                                    local_568[(long)local_4f0] = dVar36;
                                    if (bc_mode == Inhomogeneous) {
                                      local_568[(long)local_4f0] =
                                           local_550[lVar18 - (long)local_548] *
                                           *(double *)
                                            (local_388.smallend.vect +
                                            (long)(int)(uVar24 * 4 + -8) * 2) + dVar36;
                                    }
                                    goto LAB_006ce811;
                                  }
                                }
                                if (bc_mode == Inhomogeneous) {
                                  local_568[lVar18 - lVar13] = local_550[lVar18 - (long)local_548];
                                }
                                else {
                                  local_568[lVar18 - lVar13] = 0.0;
                                }
                              }
LAB_006ce811:
                              lVar18 = lVar18 + 1;
                            } while (local_528 != (int)lVar18);
                          }
                          local_5f8 = local_5f8 + 1;
                          uVar34 = local_508;
                          uVar19 = local_4d8;
                        } while (local_51c != (int)local_5f8);
                      }
                    }
                    else if (iVar5 == 0x66) {
                      if (iVar6 <= iVar29) {
                        lVar13 = local_4b0.jstride * 4;
                        lVar18 = (local_510 - local_4b0.begin.y) * lVar13;
                        lVar30 = (long)local_4b0.p +
                                 (long)(local_530 - local_4b0.begin.z) * local_4b0.kstride * 4 +
                                 lVar18 + (long)local_4b0.begin.x * -4 + local_468;
                        lVar23 = (long)local_4b0.p +
                                 local_4b0.kstride * 4 * (long)((int)local_5a8 - local_4b0.begin.z)
                                 + lVar18 + (long)local_4b0.begin.x * -4 + local_468;
                        lVar18 = local_510;
                        do {
                          if ((int)local_570 <= iVar26) {
                            lVar32 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                            lVar31 = 0;
                            do {
                              if ((*(int *)(lVar23 + lVar31 * 4) == 0) &&
                                 (*(int *)(lVar30 + lVar31 * 4) == 1)) {
                                *(undefined8 *)
                                 ((long)local_5f0.p +
                                 lVar31 * 8 +
                                 (long)((int)local_5a8 - local_5f0.begin.z) * local_5f0.kstride * 8
                                 + lVar32 * 8 + local_5f0.nstride * local_580 +
                                 (long)local_5f0.begin.x * -8 + local_430) =
                                     *(undefined8 *)
                                      ((long)local_5f0.p +
                                      lVar31 * 8 +
                                      local_5f0.kstride * 8 * (long)(local_530 - local_5f0.begin.z)
                                      + lVar32 * 8 + local_5f0.nstride * local_580 +
                                      (long)local_5f0.begin.x * -8 + local_430);
                              }
                              lVar31 = lVar31 + 1;
                            } while (iVar21 != (int)lVar31);
                          }
                          lVar18 = lVar18 + 1;
                          lVar30 = lVar30 + lVar13;
                          lVar23 = lVar23 + lVar13;
                        } while (local_51c != (int)lVar18);
                      }
                    }
                    else if ((iVar5 == 0x67) && (iVar6 <= iVar29)) {
                      lVar13 = local_4b0.jstride * 4;
                      lVar18 = (local_510 - local_4b0.begin.y) * lVar13;
                      lVar30 = (long)local_4b0.p +
                               (long)(local_530 - local_4b0.begin.z) * local_4b0.kstride * 4 +
                               lVar18 + (long)local_4b0.begin.x * -4 + local_468;
                      lVar23 = (long)local_4b0.p +
                               local_4b0.kstride * 4 * (long)((int)local_5a8 - local_4b0.begin.z) +
                               lVar18 + (long)local_4b0.begin.x * -4 + local_468;
                      lVar18 = local_510;
                      do {
                        if ((int)local_570 <= iVar26) {
                          lVar32 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                          lVar31 = 0;
                          do {
                            if ((*(int *)(lVar23 + lVar31 * 4) == 0) &&
                               (*(int *)(lVar30 + lVar31 * 4) == 1)) {
                              *(ulong *)((long)local_5f0.p +
                                        lVar31 * 8 +
                                        (long)((int)local_5a8 - local_5f0.begin.z) *
                                        local_5f0.kstride * 8 + lVar32 * 8 +
                                        local_5f0.nstride * local_580 + (long)local_5f0.begin.x * -8
                                        + local_430) =
                                   *(ulong *)((long)local_5f0.p +
                                             lVar31 * 8 +
                                             local_5f0.kstride * 8 *
                                             (long)(local_530 - local_5f0.begin.z) + lVar32 * 8 +
                                             local_5f0.nstride * local_580 +
                                             (long)local_5f0.begin.x * -8 + local_430) ^
                                   0x8000000000000000;
                            }
                            lVar31 = lVar31 + 1;
                          } while (iVar21 != (int)lVar31);
                        }
                        lVar18 = lVar18 + 1;
                        lVar30 = lVar30 + lVar13;
                        lVar23 = lVar23 + lVar13;
                      } while (local_51c != (int)lVar18);
                    }
                    if ((int)local_558 == 0x65) {
                      local_320[0] = -(double)local_1e8 * local_220;
                      local_320[1] = 0.5;
                      local_320[2] = 1.5;
                      local_320[3] = 2.5;
                      local_338 = 0;
                      uStack_330 = 0;
                      local_348 = 0;
                      uStack_340 = 0;
                      local_358 = 0;
                      uStack_350 = 0;
                      local_368 = 0;
                      uStack_360 = 0;
                      local_388.bigend.vect[1] = 0;
                      local_388.bigend.vect[2] = 0;
                      local_388.btype.itype = 0;
                      uStack_36c = 0;
                      local_388.smallend.vect[0] = 0;
                      local_388.smallend.vect[1] = 0;
                      local_388.smallend.vect[2] = 0;
                      local_388.bigend.vect[0] = 0;
                      if (1 < (int)local_418) {
                        lVar18 = 2;
                        uVar34 = 0;
                        do {
                          lVar13 = 0;
                          do {
                            lVar23 = 0;
                            dVar36 = dVar37;
                            dVar38 = dVar39;
                            do {
                              if (lVar13 != lVar23) {
                                dVar36 = dVar36 * (-0.5 - local_320[lVar23]);
                                dVar38 = dVar38 * (local_320[lVar13] - local_320[lVar23]);
                              }
                              lVar23 = lVar23 + 1;
                            } while (lVar18 != lVar23);
                            *(double *)((long)&local_388 + (uVar34 * 4 + lVar13) * 8) =
                                 dVar36 / dVar38;
                            lVar13 = lVar13 + 1;
                          } while (lVar13 != lVar18);
                          uVar34 = uVar34 + 1;
                          lVar18 = lVar18 + 1;
                        } while (uVar34 != uVar19);
                      }
                      uVar34 = local_508;
                      uVar19 = local_4d8;
                      local_388.smallend.vect._0_8_ =
                           CONCAT44(local_388.smallend.vect[1],local_388.smallend.vect[0]);
                      if ((int)local_590 <= iVar22) {
                        local_4d0 = (double *)local_4b0.p;
                        local_450 = (double *)local_4b0.jstride;
                        local_440 = (double *)(long)local_4b0.begin.y;
                        local_4f0 = (double *)
                                    ((~local_4b0.begin.z + (int)local_598) * local_4b0.kstride);
                        local_5f8 = local_518;
                        do {
                          if (local_600 <= iVar11) {
                            local_558 = (int *)(long)local_3c8.begin.x;
                            local_5b0 = local_3c8.p +
                                        (local_5f8 - local_3c8.begin.y) * local_3c8.jstride;
                            lVar13 = (long)local_5f0.begin.x;
                            local_448 = local_5f0.p +
                                        (local_5f8 - local_5f0.begin.y) * local_5f0.jstride +
                                        local_5f0.nstride * local_4c0;
                            local_568 = local_448 +
                                        ((int)local_598 - local_5f0.begin.z) * local_5f0.kstride;
                            local_588 = (double *)(long)local_2a8.begin.x;
                            local_548 = (double *)
                                        CONCAT44(local_548._4_4_,(int)local_598 - local_3c8.begin.z)
                            ;
                            local_550 = local_2a8.p +
                                        (local_5f8 - local_2a8.begin.y) * local_2a8.jstride +
                                        ((long)(int)local_598 - (long)local_2a8.begin.z) *
                                        local_2a8.kstride + local_2a8.nstride * local_4c0;
                            local_4c8 = (double *)
                                        CONCAT44(local_4c8._4_4_,local_4b8 - local_5f0.begin.z);
                            lVar18 = local_2c0;
                            do {
                              lVar23 = (lVar18 - local_4b0.begin.x) * 4 +
                                       (local_5f8 - (long)local_440) * local_4b0.jstride * 4;
                              if ((*(int *)((long)local_4b0.p +
                                           ((int)local_598 - local_4b0.begin.z) * local_4b0.kstride
                                           * 4 + lVar23) == 0) &&
                                 (*(int *)((long)local_4b0.p + (long)local_4f0 * 4 + lVar23) == 1))
                              {
                                if (1 < (int)uVar25) {
                                  uVar34 = 0;
                                  bVar33 = false;
                                  iVar5 = (int)local_598 - local_3c8.begin.z;
                                  do {
                                    if (local_5b0[(lVar18 - (long)local_558) +
                                                  iVar5 * local_3c8.kstride] <= 0.0) {
                                      uVar19 = (ulong)((int)uVar34 + 1);
                                      break;
                                    }
                                    bVar33 = (bool)(bVar33 | local_5b0[(lVar18 - (long)local_558) +
                                                                       iVar5 * local_3c8.kstride] <
                                                             1.0);
                                    uVar34 = uVar34 + 1;
                                    iVar5 = iVar5 + -1;
                                    uVar19 = uVar35;
                                  } while (local_2b0 != uVar34);
                                  uVar10 = (uint)uVar19;
                                  uVar24 = 2;
                                  if (uVar10 < 2) {
                                    uVar24 = uVar10;
                                  }
                                  if (!bVar33) {
                                    uVar24 = uVar10;
                                  }
                                  if (uVar24 != 1) {
                                    lVar23 = lVar18 - lVar13;
                                    uVar34 = 2;
                                    if (2 < uVar24) {
                                      uVar34 = (ulong)uVar24;
                                    }
                                    dVar37 = 0.0;
                                    uVar19 = 1;
                                    iVar5 = local_4b8 - local_5f0.begin.z;
                                    do {
                                      dVar37 = dVar37 + local_448[lVar23 + local_5f0.kstride * iVar5
                                                                 ] *
                                                        *(double *)
                                                         (local_388.smallend.vect +
                                                         ((long)(int)(uVar24 * 4 + -8) + uVar19) * 2
                                                         );
                                      uVar19 = uVar19 + 1;
                                      iVar5 = iVar5 + -1;
                                    } while (uVar34 != uVar19);
                                    local_568[lVar23] = dVar37;
                                    if (bc_mode == Inhomogeneous) {
                                      local_568[lVar23] =
                                           local_550[lVar18 - (long)local_588] *
                                           *(double *)
                                            (local_388.smallend.vect +
                                            (long)(int)(uVar24 * 4 + -8) * 2) + dVar37;
                                    }
                                    goto LAB_006ceff5;
                                  }
                                }
                                if (bc_mode == Inhomogeneous) {
                                  local_568[lVar18 - lVar13] = local_550[lVar18 - (long)local_588];
                                }
                                else {
                                  local_568[lVar18 - lVar13] = 0.0;
                                }
                              }
LAB_006ceff5:
                              lVar18 = lVar18 + 1;
                            } while (local_524 != (int)lVar18);
                          }
                          local_5f8 = local_5f8 + 1;
                          uVar34 = local_508;
                          uVar19 = local_4d8;
                          local_388.smallend.vect._0_8_ =
                               CONCAT44(local_388.smallend.vect[1],local_388.smallend.vect[0]);
                        } while (local_520 != (int)local_5f8);
                      }
                    }
                    else if ((int)local_558 == 0x66) {
                      if ((int)local_590 <= iVar22) {
                        lVar13 = local_4b0.jstride * 4;
                        lVar18 = (local_518 - local_4b0.begin.y) * lVar13;
                        lVar30 = (long)local_4b0.p +
                                 (long)(local_4b8 - local_4b0.begin.z) * local_4b0.kstride * 4 +
                                 lVar18 + (long)local_4b0.begin.x * -4 + local_470;
                        lVar23 = (long)local_4b0.p +
                                 local_4b0.kstride * 4 * (long)((int)local_598 - local_4b0.begin.z)
                                 + lVar18 + (long)local_4b0.begin.x * -4 + local_470;
                        lVar18 = local_518;
                        do {
                          if (local_600 <= iVar11) {
                            lVar32 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                            lVar31 = 0;
                            do {
                              if ((*(int *)(lVar23 + lVar31 * 4) == 0) &&
                                 (*(int *)(lVar30 + lVar31 * 4) == 1)) {
                                *(undefined8 *)
                                 ((long)local_5f0.p +
                                 lVar31 * 8 +
                                 (long)((int)local_598 - local_5f0.begin.z) * local_5f0.kstride * 8
                                 + lVar32 * 8 + local_5f0.nstride * local_580 +
                                 (long)local_5f0.begin.x * -8 + local_438) =
                                     *(undefined8 *)
                                      ((long)local_5f0.p +
                                      lVar31 * 8 +
                                      local_5f0.kstride * 8 * (long)(local_4b8 - local_5f0.begin.z)
                                      + lVar32 * 8 + local_5f0.nstride * local_580 +
                                      (long)local_5f0.begin.x * -8 + local_438);
                              }
                              lVar31 = lVar31 + 1;
                            } while ((int)uVar34 != (int)lVar31);
                          }
                          lVar18 = lVar18 + 1;
                          lVar30 = lVar30 + lVar13;
                          lVar23 = lVar23 + lVar13;
                        } while (local_520 != (int)lVar18);
                      }
                    }
                    else if (((int)local_558 == 0x67) && ((int)local_590 <= iVar22)) {
                      lVar13 = local_4b0.jstride * 4;
                      lVar18 = (local_518 - local_4b0.begin.y) * lVar13;
                      lVar30 = (long)local_4b0.p +
                               (long)(local_4b8 - local_4b0.begin.z) * local_4b0.kstride * 4 +
                               lVar18 + (long)local_4b0.begin.x * -4 + local_470;
                      lVar23 = (long)local_4b0.p +
                               local_4b0.kstride * 4 * (long)((int)local_598 - local_4b0.begin.z) +
                               lVar18 + (long)local_4b0.begin.x * -4 + local_470;
                      lVar18 = local_518;
                      do {
                        if (local_600 <= iVar11) {
                          lVar32 = (lVar18 - local_5f0.begin.y) * local_5f0.jstride;
                          lVar31 = 0;
                          do {
                            if ((*(int *)(lVar23 + lVar31 * 4) == 0) &&
                               (*(int *)(lVar30 + lVar31 * 4) == 1)) {
                              *(ulong *)((long)local_5f0.p +
                                        lVar31 * 8 +
                                        (long)((int)local_598 - local_5f0.begin.z) *
                                        local_5f0.kstride * 8 + lVar32 * 8 +
                                        local_5f0.nstride * local_580 + (long)local_5f0.begin.x * -8
                                        + local_438) =
                                   *(ulong *)((long)local_5f0.p +
                                             lVar31 * 8 +
                                             local_5f0.kstride * 8 *
                                             (long)(local_4b8 - local_5f0.begin.z) + lVar32 * 8 +
                                             local_5f0.nstride * local_580 +
                                             (long)local_5f0.begin.x * -8 + local_438) ^
                                   0x8000000000000000;
                            }
                            lVar31 = lVar31 + 1;
                          } while ((int)uVar34 != (int)lVar31);
                        }
                        lVar18 = lVar18 + 1;
                        lVar30 = lVar30 + lVar13;
                        lVar23 = lVar23 + lVar13;
                      } while (local_520 != (int)lVar18);
                    }
                  }
                }
              }
              uVar8 = local_4c0 + 1;
              local_580 = local_580 + 8;
            } while (uVar8 != local_120);
          }
          lVar18 = local_208 + 1;
        } while (lVar18 != 3);
      }
      else {
        piVar17 = &local_108.currentIndex;
        if (local_108.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar17 = ((local_108.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_108.currentIndex;
        }
        local_324 = EBCellFlagFab::getType
                              ((local_1f8->m_fabs_v).
                               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[*piVar17],(Box *)local_1a4)
        ;
        if (local_324 != covered) goto LAB_006cb515;
      }
      MFIter::operator++(&local_108);
    } while (local_108.currentIndex < local_108.endIndex);
  }
  MFIter::~MFIter(&local_108);
  local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_0080bbd8;
  BaseFab<double>::clear(&local_78);
  return;
}

Assistant:

void
MLEBABecLap::applyBC (int amrlev, int mglev, MultiFab& in, BCMode bc_mode, StateMode s_mode,
                      const MLMGBndry* bndry, bool skip_fillboundary) const
{
    BL_PROFILE("MLEBABecLap::applyBC()");

    // No coarsened boundary values, cannot apply inhomog at mglev>0.
    BL_ASSERT(mglev == 0 || bc_mode == BCMode::Homogeneous);
    BL_ASSERT(bndry != nullptr || bc_mode == BCMode::Homogeneous);

    const int ncomp = getNComp();
    if (!skip_fillboundary) {
        const int cross = false;
        in.FillBoundary(0, ncomp, m_geom[amrlev][mglev].periodicity(),cross);
    }

    int m_is_inhomog = bc_mode == BCMode::Inhomogeneous;
    int flagbc = m_is_inhomog;
    m_is_eb_inhomog = s_mode == StateMode::Solution;
    const int imaxorder = maxorder;
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(imaxorder <= 4, "MLEBABecLap::applyBC: maxorder too high");

    const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
    const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : 1.0;
    const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : 1.0;

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];

    const auto& ccmask = m_cc_mask[amrlev][mglev];

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};

    FArrayBox foofab(Box::TheUnitBox(),ncomp);
    const auto& foo = foofab.array();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& vbx   = mfi.validbox();
        const auto& iofab = in.array(mfi);

        auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;
        if (fabtyp != FabType::covered)
        {
            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                const Orientation olo(idim,Orientation::low);
                const Orientation ohi(idim,Orientation::high);
                Box blo = amrex::adjCellLo(vbx, idim);
                Box bhi = amrex::adjCellHi(vbx, idim);
                if (fabtyp != FabType::regular) {
                    blo.grow(IntVect(1)-IntVect::TheDimensionVector(idim));
                    bhi.grow(IntVect(1)-IntVect::TheDimensionVector(idim));
                }
                const int blen = vbx.length(idim);
                const auto& mlo = maskvals[olo].array(mfi);
                const auto& mhi = maskvals[ohi].array(mfi);
                const auto& bvlo = (bndry != nullptr) ? bndry->bndryValues(olo).array(mfi) : foo;
                const auto& bvhi = (bndry != nullptr) ? bndry->bndryValues(ohi).array(mfi) : foo;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    const BoundCond bctlo = bdcv[icomp][olo];
                    const BoundCond bcthi = bdcv[icomp][ohi];
                    const Real bcllo = bdlv[icomp][olo];
                    const Real bclhi = bdlv[icomp][ohi];
                    if (fabtyp == FabType::regular)
                    {
                        if (idim == 0) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_x(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dxi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_x(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dxi, flagbc, icomp);
                            });
                        } else if (idim == 1) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_y(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dyi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_y(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dyi, flagbc, icomp);
                            });
                        } else {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mllinop_apply_bc_z(0, tboxlo, blen, iofab, mlo,
                                               bctlo, bcllo, bvlo,
                                               imaxorder, dzi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mllinop_apply_bc_z(1, tboxhi, blen, iofab, mhi,
                                               bcthi, bclhi, bvhi,
                                               imaxorder, dzi, flagbc, icomp);
                            });
                        }
                    }
                    else // irregular
                    {
                        const auto& ap = area[idim]->const_array(mfi);
                        const auto& mask = ccmask.const_array(mfi);
                        if (idim == 0) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_x(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dxi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_x(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dxi, flagbc, icomp);
                            });
                        } else if (idim == 1) {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_y(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dyi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_y(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dyi, flagbc, icomp);
                            });
                        } else {
                            AMREX_LAUNCH_HOST_DEVICE_LAMBDA (
                            blo, tboxlo, {
                            mlebabeclap_apply_bc_z(0, tboxlo, blen, iofab, mask, ap,
                                                   bctlo, bcllo, bvlo,
                                                   imaxorder, dzi, flagbc, icomp);
                            },
                            bhi, tboxhi, {
                            mlebabeclap_apply_bc_z(1, tboxhi, blen, iofab, mask, ap,
                                                   bcthi, bclhi, bvhi,
                                                   imaxorder, dzi, flagbc, icomp);
                            });
                        }
                    }
                }
            }
        }
    }
}